

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::LayerNorm_x86_avx512::forward_inplace
          (LayerNorm_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  uint *puVar2;
  undefined4 uVar3;
  int iVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  byte bVar30;
  byte bVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  int iVar36;
  undefined1 (*pauVar37) [64];
  int iVar38;
  uint uVar39;
  uint uVar40;
  undefined1 (*pauVar41) [64];
  ulong uVar42;
  undefined1 (*pauVar43) [64];
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  uint uVar47;
  ulong uVar48;
  undefined1 (*pauVar49) [64];
  undefined1 (*pauVar50) [64];
  uint uVar51;
  long lVar52;
  ushort uVar53;
  undefined1 auVar62 [32];
  undefined1 auVar57 [16];
  undefined1 auVar63 [32];
  undefined1 auVar58 [16];
  undefined1 auVar64 [32];
  undefined1 auVar54 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar55 [16];
  undefined1 auVar134 [48];
  undefined1 auVar74 [64];
  undefined1 auVar56 [16];
  undefined1 auVar75 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar61 [16];
  undefined1 auVar65 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar106 [64];
  undefined1 auVar108 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar126 [64];
  undefined1 auVar128 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  float _mean;
  float fVar135;
  float fVar137;
  undefined1 auVar136 [64];
  float fVar138;
  float fVar140;
  __m128 _b_128;
  undefined1 auVar139 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float _a;
  float fVar147;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float _b;
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar184 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar185 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar78 [64];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar88 [64];
  undefined1 auVar98 [64];
  undefined1 auVar105 [64];
  undefined1 auVar107 [64];
  undefined1 auVar109 [64];
  undefined1 auVar119 [64];
  undefined1 auVar125 [64];
  undefined1 auVar127 [64];
  undefined1 auVar129 [64];
  
  auVar136 = _DAT_005a3b00;
  iVar36 = bottom_top_blob->elempack;
  iVar38 = bottom_top_blob->dims;
  iVar4 = bottom_top_blob->w;
  pp_Var5 = this->_vptr_LayerNorm_x86_avx512;
  p_Var6 = pp_Var5[-3];
  pauVar43 = *(undefined1 (**) [64])(&this->field_0xe0 + (long)p_Var6);
  pauVar50 = *(undefined1 (**) [64])(&this->field_0x128 + (long)p_Var6);
  if (iVar38 == 1) {
    uVar45 = iVar4 * iVar36;
    pauVar49 = (undefined1 (*) [64])bottom_top_blob->data;
    pauVar37 = pauVar49;
    if ((int)uVar45 < 0x10) {
      uVar44 = 0;
      auVar136 = ZEXT864(0);
    }
    else {
      uVar44 = uVar45 & 0x7ffffff0;
      auVar136 = ZEXT864(0);
      iVar36 = 0x10;
      do {
        auVar136 = vaddps_avx512f(auVar136,*pauVar37);
        pauVar37 = pauVar37 + 1;
        iVar36 = iVar36 + 0x10;
      } while (iVar36 <= (int)uVar45);
    }
    fVar135 = 0.0;
    fVar147 = 0.0;
    fVar138 = 0.0;
    fVar140 = 0.0;
    fVar141 = 0.0;
    fVar142 = 0.0;
    fVar143 = 0.0;
    fVar144 = 0.0;
    uVar47 = uVar44 | 8;
    while ((int)uVar47 <= (int)uVar45) {
      fVar138 = fVar138 + *(float *)*pauVar37;
      fVar140 = fVar140 + *(float *)(*pauVar37 + 4);
      fVar135 = fVar135 + *(float *)(*pauVar37 + 8);
      fVar147 = fVar147 + *(float *)(*pauVar37 + 0xc);
      fVar141 = fVar141 + *(float *)(*pauVar37 + 0x10);
      fVar142 = fVar142 + *(float *)(*pauVar37 + 0x14);
      fVar143 = fVar143 + *(float *)(*pauVar37 + 0x18);
      fVar144 = fVar144 + *(float *)(*pauVar37 + 0x1c);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
      uVar47 = uVar44 + 0x10;
      uVar44 = uVar44 + 8;
    }
    iVar36 = uVar44 + 4;
    auVar54 = ZEXT816(0) << 0x40;
    while (iVar36 <= (int)uVar45) {
      auVar55._0_4_ = auVar54._0_4_ + *(float *)*pauVar37;
      auVar55._4_4_ = auVar54._4_4_ + *(float *)(*pauVar37 + 4);
      auVar55._8_4_ = auVar54._8_4_ + *(float *)(*pauVar37 + 8);
      auVar55._12_4_ = auVar54._12_4_ + *(float *)(*pauVar37 + 0xc);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
      iVar36 = uVar44 + 8;
      auVar54 = auVar55;
      uVar44 = uVar44 + 4;
    }
    fVar148 = 0.0;
    if ((int)uVar44 < (int)uVar45) {
      auVar69 = vpbroadcastq_avx512f();
      uVar48 = 0;
      auVar184 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar70 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        auVar72 = auVar68;
        auVar68 = vpbroadcastq_avx512f();
        auVar71 = vporq_avx512f(auVar68,auVar184);
        auVar68 = vporq_avx512f(auVar68,auVar70);
        uVar20 = vpcmpuq_avx512f(auVar68,auVar69,2);
        bVar30 = (byte)uVar20;
        uVar20 = vpcmpuq_avx512f(auVar71,auVar69,2);
        bVar31 = (byte)uVar20;
        uVar53 = CONCAT11(bVar31,bVar30);
        piVar1 = (int *)(*pauVar37 + uVar48 * 4);
        auVar68._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
        auVar68._0_4_ = (uint)(bVar30 & 1) * *piVar1;
        auVar68._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
        auVar68._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
        auVar68._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
        auVar68._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
        auVar68._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
        auVar68._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
        auVar68._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
        auVar68._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
        auVar68._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
        auVar68._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
        auVar68._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
        auVar68._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
        auVar68._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
        auVar68._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
        auVar68 = vaddps_avx512f(auVar68,auVar72);
        uVar48 = uVar48 + 0x10;
      } while (((ulong)(~uVar44 + uVar45) + 0x10 & 0x1fffffff0) != uVar48);
      auVar69._0_4_ = (uint)(bVar30 & 1) * auVar68._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar72._0_4_
      ;
      bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
      auVar69._4_4_ = (uint)bVar7 * auVar68._4_4_ | (uint)!bVar7 * auVar72._4_4_;
      bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
      auVar69._8_4_ = (uint)bVar7 * auVar68._8_4_ | (uint)!bVar7 * auVar72._8_4_;
      bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
      auVar69._12_4_ = (uint)bVar7 * auVar68._12_4_ | (uint)!bVar7 * auVar72._12_4_;
      bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
      auVar69._16_4_ = (uint)bVar7 * auVar68._16_4_ | (uint)!bVar7 * auVar72._16_4_;
      bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
      auVar69._20_4_ = (uint)bVar7 * auVar68._20_4_ | (uint)!bVar7 * auVar72._20_4_;
      bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
      auVar69._24_4_ = (uint)bVar7 * auVar68._24_4_ | (uint)!bVar7 * auVar72._24_4_;
      bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
      auVar69._28_4_ = (uint)bVar7 * auVar68._28_4_ | (uint)!bVar7 * auVar72._28_4_;
      auVar69._32_4_ =
           (uint)(bVar31 & 1) * auVar68._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar72._32_4_;
      bVar7 = (bool)(bVar31 >> 1 & 1);
      auVar69._36_4_ = (uint)bVar7 * auVar68._36_4_ | (uint)!bVar7 * auVar72._36_4_;
      bVar7 = (bool)(bVar31 >> 2 & 1);
      auVar69._40_4_ = (uint)bVar7 * auVar68._40_4_ | (uint)!bVar7 * auVar72._40_4_;
      bVar7 = (bool)(bVar31 >> 3 & 1);
      auVar69._44_4_ = (uint)bVar7 * auVar68._44_4_ | (uint)!bVar7 * auVar72._44_4_;
      bVar7 = (bool)(bVar31 >> 4 & 1);
      auVar69._48_4_ = (uint)bVar7 * auVar68._48_4_ | (uint)!bVar7 * auVar72._48_4_;
      bVar7 = (bool)(bVar31 >> 5 & 1);
      auVar69._52_4_ = (uint)bVar7 * auVar68._52_4_ | (uint)!bVar7 * auVar72._52_4_;
      bVar7 = (bool)(bVar31 >> 6 & 1);
      auVar69._56_4_ = (uint)bVar7 * auVar68._56_4_ | (uint)!bVar7 * auVar72._56_4_;
      auVar69._60_4_ =
           (uint)(bVar31 >> 7) * auVar68._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar72._60_4_;
      auVar66 = vextractf64x4_avx512f(auVar69,1);
      auVar68 = vaddps_avx512f(auVar69,ZEXT3264(auVar66));
      auVar56._0_4_ = auVar68._0_4_ + auVar68._16_4_;
      auVar56._4_4_ = auVar68._4_4_ + auVar68._20_4_;
      auVar56._8_4_ = auVar68._8_4_ + auVar68._24_4_;
      auVar56._12_4_ = auVar68._12_4_ + auVar68._28_4_;
      auVar55 = vshufpd_avx(auVar56,auVar56,1);
      auVar58._0_4_ = auVar56._0_4_ + auVar55._0_4_;
      auVar58._4_4_ = auVar56._4_4_ + auVar55._4_4_;
      auVar58._8_4_ = auVar56._8_4_ + auVar55._8_4_;
      auVar58._12_4_ = auVar56._12_4_ + auVar55._12_4_;
      auVar55 = vhaddps_avx(auVar58,auVar58);
      fVar148 = auVar55._0_4_;
    }
    auVar66 = vextractf64x4_avx512f(auVar136,1);
    fVar137 = auVar136._4_4_ + auVar66._4_4_;
    auVar57._0_4_ = auVar136._0_4_ + auVar66._0_4_ + auVar136._16_4_ + auVar66._16_4_;
    auVar57._4_4_ = fVar137 + fVar137;
    auVar57._8_4_ = auVar136._8_4_ + auVar66._8_4_ + auVar136._24_4_ + auVar66._24_4_;
    auVar57._12_4_ = auVar136._12_4_ + auVar66._12_4_ + auVar136._28_4_ + auVar66._28_4_;
    auVar55 = vshufpd_avx(auVar57,auVar57,1);
    auVar59._0_4_ = auVar55._0_4_ + auVar57._0_4_;
    auVar59._4_4_ = auVar55._4_4_ + auVar57._4_4_;
    auVar59._8_4_ = auVar55._8_4_ + auVar57._8_4_;
    auVar59._12_4_ = auVar55._12_4_ + auVar57._12_4_;
    auVar55 = vmovshdup_avx(auVar59);
    auVar60._0_4_ = fVar141 + fVar138;
    auVar60._4_4_ = fVar142 + fVar140;
    auVar60._8_4_ = fVar143 + fVar135;
    auVar60._12_4_ = fVar144 + fVar147;
    auVar56 = vshufps_avx(auVar54,auVar60,0x11);
    auVar54 = vshufps_avx(auVar54,auVar60,0xbb);
    auVar61._0_4_ = auVar54._0_4_ + auVar56._0_4_;
    auVar61._4_4_ = auVar54._4_4_ + auVar56._4_4_;
    auVar61._8_4_ = auVar54._8_4_ + auVar56._8_4_;
    auVar61._12_4_ = auVar54._12_4_ + auVar56._12_4_;
    auVar54 = vshufpd_avx(auVar61,auVar61,1);
    auVar139._0_4_ = auVar61._0_4_ + auVar54._0_4_;
    auVar139._4_4_ = auVar61._4_4_ + auVar54._4_4_;
    auVar139._8_4_ = auVar61._8_4_ + auVar54._8_4_;
    auVar139._12_4_ = auVar61._12_4_ + auVar54._12_4_;
    auVar54 = vhaddps_avx(auVar139,auVar139);
    auVar54._0_4_ = (auVar59._0_4_ + auVar55._0_4_ + fVar148 + auVar54._0_4_) / (float)(int)uVar45;
    auVar54._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar136 = vbroadcastss_avx512f(auVar54);
    pauVar37 = pauVar49;
    if ((int)uVar45 < 0x10) {
      uVar44 = 0;
      auVar68 = ZEXT864(0) << 0x20;
    }
    else {
      uVar44 = uVar45 & 0x7ffffff0;
      auVar68 = ZEXT864(0) << 0x40;
      iVar36 = 0x10;
      do {
        auVar69 = vsubps_avx512f(*pauVar37,auVar136);
        auVar68 = vfmadd231ps_avx512f(auVar68,auVar69,auVar69);
        pauVar37 = pauVar37 + 1;
        iVar36 = iVar36 + 0x10;
      } while (iVar36 <= (int)uVar45);
    }
    auVar55 = ZEXT816(0) << 0x40;
    uVar47 = uVar44 | 8;
    while ((int)uVar47 <= (int)uVar45) {
      auVar66 = vsubps_avx(*(undefined1 (*) [32])*pauVar37,auVar136._0_32_);
      auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar66,auVar66);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
      uVar47 = uVar44 + 0x10;
      uVar44 = uVar44 + 8;
    }
    auVar56 = ZEXT816(0) << 0x40;
    iVar36 = uVar44 + 4;
    while (iVar36 <= (int)uVar45) {
      auVar58 = vsubps_avx(*(undefined1 (*) [16])*pauVar37,auVar136._0_16_);
      auVar56 = vfmadd231ps_fma(auVar56,auVar58,auVar58);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
      iVar36 = uVar44 + 8;
      uVar44 = uVar44 + 4;
    }
    fVar135 = 0.0;
    if ((int)uVar44 < (int)uVar45) {
      auVar184 = vpbroadcastq_avx512f();
      uVar48 = 0;
      auVar70 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar71 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        auVar73 = auVar69;
        auVar69 = vpbroadcastq_avx512f();
        auVar72 = vporq_avx512f(auVar69,auVar70);
        auVar69 = vporq_avx512f(auVar69,auVar71);
        uVar20 = vpcmpuq_avx512f(auVar69,auVar184,2);
        bVar30 = (byte)uVar20;
        uVar20 = vpcmpuq_avx512f(auVar72,auVar184,2);
        bVar31 = (byte)uVar20;
        uVar53 = CONCAT11(bVar31,bVar30);
        piVar1 = (int *)(*pauVar37 + uVar48 * 4);
        auVar72._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
        auVar72._0_4_ = (uint)(bVar30 & 1) * *piVar1;
        auVar72._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
        auVar72._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
        auVar72._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
        auVar72._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
        auVar72._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
        auVar72._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
        auVar72._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
        auVar72._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
        auVar72._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
        auVar72._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
        auVar72._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
        auVar72._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
        auVar72._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
        auVar72._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
        auVar69 = vsubps_avx512f(auVar72,auVar136);
        auVar69 = vfmadd213ps_avx512f(auVar69,auVar69,auVar73);
        uVar48 = uVar48 + 0x10;
      } while (((ulong)(~uVar44 + uVar45) + 0x10 & 0x1fffffff0) != uVar48);
      auVar136._0_4_ =
           (uint)(bVar30 & 1) * auVar69._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar73._0_4_;
      bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
      auVar136._4_4_ = (uint)bVar7 * auVar69._4_4_ | (uint)!bVar7 * auVar73._4_4_;
      bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
      auVar136._8_4_ = (uint)bVar7 * auVar69._8_4_ | (uint)!bVar7 * auVar73._8_4_;
      bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
      auVar136._12_4_ = (uint)bVar7 * auVar69._12_4_ | (uint)!bVar7 * auVar73._12_4_;
      bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
      auVar136._16_4_ = (uint)bVar7 * auVar69._16_4_ | (uint)!bVar7 * auVar73._16_4_;
      bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
      auVar136._20_4_ = (uint)bVar7 * auVar69._20_4_ | (uint)!bVar7 * auVar73._20_4_;
      bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
      auVar136._24_4_ = (uint)bVar7 * auVar69._24_4_ | (uint)!bVar7 * auVar73._24_4_;
      bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
      auVar136._28_4_ = (uint)bVar7 * auVar69._28_4_ | (uint)!bVar7 * auVar73._28_4_;
      auVar136._32_4_ =
           (uint)(bVar31 & 1) * auVar69._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar73._32_4_;
      bVar7 = (bool)(bVar31 >> 1 & 1);
      auVar136._36_4_ = (uint)bVar7 * auVar69._36_4_ | (uint)!bVar7 * auVar73._36_4_;
      bVar7 = (bool)(bVar31 >> 2 & 1);
      auVar136._40_4_ = (uint)bVar7 * auVar69._40_4_ | (uint)!bVar7 * auVar73._40_4_;
      bVar7 = (bool)(bVar31 >> 3 & 1);
      auVar136._44_4_ = (uint)bVar7 * auVar69._44_4_ | (uint)!bVar7 * auVar73._44_4_;
      bVar7 = (bool)(bVar31 >> 4 & 1);
      auVar136._48_4_ = (uint)bVar7 * auVar69._48_4_ | (uint)!bVar7 * auVar73._48_4_;
      bVar7 = (bool)(bVar31 >> 5 & 1);
      auVar136._52_4_ = (uint)bVar7 * auVar69._52_4_ | (uint)!bVar7 * auVar73._52_4_;
      bVar7 = (bool)(bVar31 >> 6 & 1);
      auVar136._56_4_ = (uint)bVar7 * auVar69._56_4_ | (uint)!bVar7 * auVar73._56_4_;
      auVar136._60_4_ =
           (uint)(bVar31 >> 7) * auVar69._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar73._60_4_;
      auVar66 = vextractf64x4_avx512f(auVar136,1);
      auVar136 = vaddps_avx512f(auVar136,ZEXT3264(auVar66));
      auVar149._0_4_ = auVar136._0_4_ + auVar136._16_4_;
      auVar149._4_4_ = auVar136._4_4_ + auVar136._20_4_;
      auVar149._8_4_ = auVar136._8_4_ + auVar136._24_4_;
      auVar149._12_4_ = auVar136._12_4_ + auVar136._28_4_;
      auVar58 = vshufpd_avx(auVar149,auVar149,1);
      auVar150._0_4_ = auVar149._0_4_ + auVar58._0_4_;
      auVar150._4_4_ = auVar149._4_4_ + auVar58._4_4_;
      auVar150._8_4_ = auVar149._8_4_ + auVar58._8_4_;
      auVar150._12_4_ = auVar149._12_4_ + auVar58._12_4_;
      auVar58 = vhaddps_avx(auVar150,auVar150);
      fVar135 = auVar58._0_4_;
    }
    auVar66 = vextractf64x4_avx512f(auVar68,1);
    fVar147 = auVar68._4_4_ + auVar66._4_4_;
    auVar145._0_4_ = auVar68._0_4_ + auVar66._0_4_ + auVar68._16_4_ + auVar66._16_4_;
    auVar145._4_4_ = fVar147 + fVar147;
    auVar145._8_4_ = auVar68._8_4_ + auVar66._8_4_ + auVar68._24_4_ + auVar66._24_4_;
    auVar145._12_4_ = auVar68._12_4_ + auVar66._12_4_ + auVar68._28_4_ + auVar66._28_4_;
    auVar58 = vshufpd_avx(auVar145,auVar145,1);
    auVar146._0_4_ = auVar58._0_4_ + auVar145._0_4_;
    auVar146._4_4_ = auVar58._4_4_ + auVar145._4_4_;
    auVar146._8_4_ = auVar58._8_4_ + auVar145._8_4_;
    auVar146._12_4_ = auVar58._12_4_ + auVar145._12_4_;
    auVar151._0_4_ = auVar55._0_4_ + 0.0;
    auVar151._4_4_ = auVar55._4_4_ + 0.0;
    auVar151._8_4_ = auVar55._8_4_ + 0.0;
    auVar151._12_4_ = auVar55._12_4_ + 0.0;
    auVar55 = vshufps_avx(auVar56,auVar151,0x11);
    auVar56 = vshufps_avx(auVar56,auVar151,0xbb);
    auVar152._0_4_ = auVar56._0_4_ + auVar55._0_4_;
    auVar152._4_4_ = auVar56._4_4_ + auVar55._4_4_;
    auVar152._8_4_ = auVar56._8_4_ + auVar55._8_4_;
    auVar152._12_4_ = auVar56._12_4_ + auVar55._12_4_;
    auVar55 = vshufpd_avx(auVar152,auVar152,1);
    auVar153._0_4_ = auVar152._0_4_ + auVar55._0_4_;
    auVar153._4_4_ = auVar152._4_4_ + auVar55._4_4_;
    auVar153._8_4_ = auVar152._8_4_ + auVar55._8_4_;
    auVar153._12_4_ = auVar152._12_4_ + auVar55._12_4_;
    auVar55 = vhaddps_avx(auVar153,auVar153);
    auVar56 = vmovshdup_avx(auVar146);
    fVar135 = (auVar146._0_4_ + auVar56._0_4_ + fVar135 + auVar55._0_4_) / (float)(int)uVar45 +
              *(float *)(&this->field_0xd4 + (long)p_Var6);
    auVar55 = vrsqrtss_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
    auVar56 = vfmadd213ss_fma(ZEXT416((uint)(fVar135 * auVar55._0_4_)),auVar55,ZEXT416(0xc0400000));
    fVar135 = auVar55._0_4_ * -0.5 * auVar56._0_4_;
    auVar24._8_4_ = 0x80000000;
    auVar24._0_8_ = 0x8000000080000000;
    auVar24._12_4_ = 0x80000000;
    auVar54 = vxorps_avx512vl(auVar54,auVar24);
    auVar136 = vbroadcastss_avx512f(ZEXT416((uint)fVar135));
    auVar54 = ZEXT416((uint)(fVar135 * auVar54._0_4_));
    auVar68 = vbroadcastss_avx512f(auVar54);
    if (*(int *)(&this->field_0xd8 + (long)p_Var6) == 0) {
      uVar44 = 0;
      if (0xf < (int)uVar45) {
        uVar44 = uVar45 & 0x7ffffff0;
        iVar36 = 0x10;
        do {
          auVar69 = vfmadd132ps_avx512f(*pauVar49,auVar68,auVar136);
          *pauVar49 = auVar69;
          pauVar49 = pauVar49 + 1;
          iVar36 = iVar36 + 0x10;
        } while (iVar36 <= (int)uVar45);
      }
      uVar47 = uVar44 | 8;
      while ((int)uVar47 <= (int)uVar45) {
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar49,auVar68._0_32_,auVar136._0_32_);
        *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar54);
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
        uVar47 = uVar44 + 0x10;
        uVar44 = uVar44 + 8;
      }
      iVar36 = uVar44 + 4;
      while (iVar36 <= (int)uVar45) {
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar49,auVar68._0_16_,auVar136._0_16_);
        *(undefined1 (*) [16])*pauVar49 = auVar54;
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
        iVar36 = uVar44 + 8;
        uVar44 = uVar44 + 4;
      }
      if ((int)uVar44 < (int)uVar45) {
        auVar69 = vpbroadcastq_avx512f();
        uVar48 = 0;
        auVar184 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar70 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar71 = vpbroadcastq_avx512f();
          auVar72 = vporq_avx512f(auVar71,auVar184);
          auVar71 = vporq_avx512f(auVar71,auVar70);
          uVar20 = vpcmpuq_avx512f(auVar71,auVar69,2);
          bVar30 = (byte)uVar20;
          uVar20 = vpcmpuq_avx512f(auVar72,auVar69,2);
          bVar31 = (byte)uVar20;
          uVar53 = CONCAT11(bVar31,bVar30);
          piVar1 = (int *)(*pauVar49 + uVar48 * 4);
          auVar71._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
          auVar71._0_4_ = (uint)(bVar30 & 1) * *piVar1;
          auVar71._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
          auVar71._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
          auVar71._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
          auVar71._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
          auVar71._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
          auVar71._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
          auVar71._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
          auVar71._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
          auVar71._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
          auVar71._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
          auVar71._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
          auVar71._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
          auVar71._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
          auVar71._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
          auVar71 = vfmadd213ps_avx512f(auVar71,auVar136,auVar68);
          puVar2 = (uint *)(*pauVar49 + uVar48 * 4);
          bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar53 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar53 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar53 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar53 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar53 >> 6) & 1);
          bVar13 = (bool)((byte)(uVar53 >> 7) & 1);
          bVar14 = (bool)(bVar31 >> 1 & 1);
          bVar15 = (bool)(bVar31 >> 2 & 1);
          bVar16 = (bool)(bVar31 >> 3 & 1);
          bVar17 = (bool)(bVar31 >> 4 & 1);
          bVar18 = (bool)(bVar31 >> 5 & 1);
          bVar19 = (bool)(bVar31 >> 6 & 1);
          *puVar2 = (uint)(bVar30 & 1) * auVar71._0_4_ | (uint)!(bool)(bVar30 & 1) * *puVar2;
          puVar2[1] = (uint)bVar7 * auVar71._4_4_ | (uint)!bVar7 * puVar2[1];
          puVar2[2] = (uint)bVar8 * auVar71._8_4_ | (uint)!bVar8 * puVar2[2];
          puVar2[3] = (uint)bVar9 * auVar71._12_4_ | (uint)!bVar9 * puVar2[3];
          puVar2[4] = (uint)bVar10 * auVar71._16_4_ | (uint)!bVar10 * puVar2[4];
          puVar2[5] = (uint)bVar11 * auVar71._20_4_ | (uint)!bVar11 * puVar2[5];
          puVar2[6] = (uint)bVar12 * auVar71._24_4_ | (uint)!bVar12 * puVar2[6];
          puVar2[7] = (uint)bVar13 * auVar71._28_4_ | (uint)!bVar13 * puVar2[7];
          puVar2[8] = (uint)(bVar31 & 1) * auVar71._32_4_ | (uint)!(bool)(bVar31 & 1) * puVar2[8];
          puVar2[9] = (uint)bVar14 * auVar71._36_4_ | (uint)!bVar14 * puVar2[9];
          puVar2[10] = (uint)bVar15 * auVar71._40_4_ | (uint)!bVar15 * puVar2[10];
          puVar2[0xb] = (uint)bVar16 * auVar71._44_4_ | (uint)!bVar16 * puVar2[0xb];
          puVar2[0xc] = (uint)bVar17 * auVar71._48_4_ | (uint)!bVar17 * puVar2[0xc];
          puVar2[0xd] = (uint)bVar18 * auVar71._52_4_ | (uint)!bVar18 * puVar2[0xd];
          puVar2[0xe] = (uint)bVar19 * auVar71._56_4_ | (uint)!bVar19 * puVar2[0xe];
          puVar2[0xf] = (uint)(bVar31 >> 7) * auVar71._60_4_ |
                        (uint)!(bool)(bVar31 >> 7) * puVar2[0xf];
          uVar48 = uVar48 + 0x10;
        } while (((ulong)(uVar45 + ~uVar44) + 0x10 & 0x1fffffff0) != uVar48);
      }
    }
    else {
      uVar44 = 0;
      if (0xf < (int)uVar45) {
        uVar44 = uVar45 & 0x7ffffff0;
        iVar36 = 0x10;
        do {
          auVar69 = vfmadd132ps_avx512f(*pauVar49,auVar68,auVar136);
          auVar69 = vfmadd213ps_avx512f(auVar69,*pauVar43,*pauVar50);
          *pauVar49 = auVar69;
          pauVar49 = pauVar49 + 1;
          pauVar43 = pauVar43 + 1;
          pauVar50 = pauVar50 + 1;
          iVar36 = iVar36 + 0x10;
        } while (iVar36 <= (int)uVar45);
      }
      uVar47 = uVar44 | 8;
      while ((int)uVar47 <= (int)uVar45) {
        auVar55 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar49,auVar68._0_32_,auVar136._0_32_);
        auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),*(undefined1 (*) [32])*pauVar43,
                                  *(undefined1 (*) [32])*pauVar50);
        *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar55);
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
        pauVar43 = (undefined1 (*) [64])(*pauVar43 + 0x20);
        pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
        uVar47 = uVar44 + 0x10;
        uVar44 = uVar44 + 8;
      }
      iVar36 = uVar44 + 4;
      while (iVar36 <= (int)uVar45) {
        auVar55 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar49,auVar68._0_16_,auVar136._0_16_);
        auVar55 = vfmadd213ps_fma(auVar55,*(undefined1 (*) [16])*pauVar43,
                                  *(undefined1 (*) [16])*pauVar50);
        *(undefined1 (*) [16])*pauVar49 = auVar55;
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
        pauVar43 = (undefined1 (*) [64])(*pauVar43 + 0x10);
        pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
        iVar36 = uVar44 + 8;
        uVar44 = uVar44 + 4;
      }
      if (uVar45 - uVar44 != 0 && (int)uVar44 <= (int)uVar45) {
        lVar52 = 0;
        do {
          auVar55 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar49 + lVar52 * 4)),auVar54,
                                    ZEXT416((uint)fVar135));
          auVar55 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar43 + lVar52 * 4)),auVar55,
                                    ZEXT416(*(uint *)(*pauVar50 + lVar52 * 4)));
          *(int *)(*pauVar49 + lVar52 * 4) = auVar55._0_4_;
          lVar52 = lVar52 + 1;
        } while (uVar45 - uVar44 != (int)lVar52);
      }
    }
  }
  else {
    uVar45 = bottom_top_blob->h;
    uVar44 = bottom_top_blob->c;
    if (iVar38 == 3) {
      if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) == iVar4) {
        if (0 < (int)uVar44) {
          pp_Var5 = this->_vptr_LayerNorm_x86_avx512;
          uVar47 = iVar4 * iVar36;
          fVar135 = 1.0 / (float)iVar4;
          auVar68 = vbroadcastss_avx512f(ZEXT416((uint)fVar135));
          uVar51 = uVar47 & 0xfffffff0;
          uVar48 = 0;
          auVar69 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar184 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar178._8_4_ = 0x80000000;
          auVar178._0_8_ = 0x8000000080000000;
          auVar178._12_4_ = 0x80000000;
          auVar54 = vbroadcastss_avx512vl(ZEXT416(0xc0400000));
          auVar180._8_4_ = 0xc0400000;
          auVar180._0_8_ = 0xc0400000c0400000;
          auVar180._12_4_ = 0xc0400000;
          auVar180._16_4_ = 0xc0400000;
          auVar180._20_4_ = 0xc0400000;
          auVar180._24_4_ = 0xc0400000;
          auVar180._28_4_ = 0xc0400000;
          auVar182._8_4_ = 0x80000000;
          auVar182._0_8_ = 0x8000000080000000;
          auVar182._12_4_ = 0x80000000;
          auVar182._16_4_ = 0x80000000;
          auVar182._20_4_ = 0x80000000;
          auVar182._24_4_ = 0x80000000;
          auVar182._28_4_ = 0x80000000;
          auVar70 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
          auVar71 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
          auVar72 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar73 = auVar72;
          do {
            if (0 < (int)uVar45) {
              uVar42 = 0;
              do {
                auVar55 = in_ZMM16._0_16_;
                pauVar49 = (undefined1 (*) [64])
                           ((long)bottom_top_blob->data +
                           (long)bottom_top_blob->w * uVar42 * bottom_top_blob->elemsize +
                           bottom_top_blob->cstep * uVar48 * bottom_top_blob->elemsize);
                auVar134 = auVar73._16_48_;
                auVar56 = in_ZMM17._0_16_;
                pauVar37 = pauVar49;
                if ((int)uVar47 < 0x10) {
                  auVar56 = vxorps_avx512vl(auVar56,auVar56);
                  auVar73 = ZEXT1664(auVar56);
                  uVar39 = 0;
                }
                else {
                  auVar56 = vxorps_avx512vl(auVar56,auVar56);
                  auVar73 = ZEXT1664(auVar56);
                  iVar38 = 0x10;
                  do {
                    auVar73 = vaddps_avx512f(auVar73,*pauVar37);
                    auVar134 = auVar73._16_48_;
                    pauVar37 = pauVar37 + 1;
                    iVar38 = iVar38 + 0x10;
                    uVar39 = uVar51;
                  } while (iVar38 <= (int)uVar47);
                }
                uVar40 = uVar39 | 8;
                auVar93._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
                auVar93._16_48_ = auVar134;
                auVar185 = ZEXT1664(auVar93._0_16_);
                auVar66 = auVar134._16_32_;
                auVar67 = ZEXT1632(auVar93._0_16_);
                while ((int)uVar40 <= (int)uVar47) {
                  auVar93._0_32_ = vaddps_avx512vl(auVar185._0_32_,*(undefined1 (*) [32])*pauVar37);
                  auVar185 = ZEXT3264(auVar93._0_32_);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                  uVar40 = uVar39 + 0x10;
                  uVar39 = uVar39 + 8;
                  auVar66 = auVar93._32_32_;
                  auVar67 = auVar93._0_32_;
                }
                iVar38 = uVar39 + 4;
                auVar56 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
                while (iVar38 <= (int)uVar47) {
                  auVar56 = vaddps_avx512vl(auVar56,*(undefined1 (*) [16])*pauVar37);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = uVar39 + 8;
                  uVar39 = uVar39 + 4;
                }
                auVar58 = ZEXT816(0) << 0x40;
                if ((int)uVar39 < (int)uVar47) {
                  auVar74 = vpbroadcastq_avx512f();
                  auVar55 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
                  uVar46 = 0;
                  auVar185 = ZEXT1664(auVar55);
                  do {
                    auVar76 = auVar185;
                    auVar185 = vpbroadcastq_avx512f();
                    auVar75 = vporq_avx512f(auVar185,auVar69);
                    auVar185 = vporq_avx512f(auVar185,auVar184);
                    uVar20 = vpcmpuq_avx512f(auVar185,auVar74,2);
                    bVar30 = (byte)uVar20;
                    uVar20 = vpcmpuq_avx512f(auVar75,auVar74,2);
                    bVar31 = (byte)uVar20;
                    uVar53 = CONCAT11(bVar31,bVar30);
                    piVar1 = (int *)(*pauVar37 + uVar46 * 4);
                    auVar94._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                    auVar94._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                    auVar94._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                    auVar94._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                    auVar94._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                    auVar94._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                    auVar94._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                    auVar94._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                    auVar94._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                    auVar94._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                    auVar94._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                    auVar94._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                    auVar94._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                    auVar94._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                    auVar94._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                    auVar94._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                    auVar185 = vaddps_avx512f(auVar94,auVar76);
                    uVar46 = uVar46 + 0x10;
                  } while (((ulong)(~uVar39 + uVar47) + 0x10 & 0x1fffffff0) != uVar46);
                  auVar95._0_4_ =
                       (uint)(bVar30 & 1) * auVar185._0_4_ |
                       (uint)!(bool)(bVar30 & 1) * auVar76._0_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                  auVar95._4_4_ = (uint)bVar7 * auVar185._4_4_ | (uint)!bVar7 * auVar76._4_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
                  auVar95._8_4_ = (uint)bVar7 * auVar185._8_4_ | (uint)!bVar7 * auVar76._8_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                  auVar95._12_4_ = (uint)bVar7 * auVar185._12_4_ | (uint)!bVar7 * auVar76._12_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
                  auVar95._16_4_ = (uint)bVar7 * auVar185._16_4_ | (uint)!bVar7 * auVar76._16_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
                  auVar95._20_4_ = (uint)bVar7 * auVar185._20_4_ | (uint)!bVar7 * auVar76._20_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
                  auVar95._24_4_ = (uint)bVar7 * auVar185._24_4_ | (uint)!bVar7 * auVar76._24_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
                  auVar95._28_4_ = (uint)bVar7 * auVar185._28_4_ | (uint)!bVar7 * auVar76._28_4_;
                  auVar95._32_4_ =
                       (uint)(bVar31 & 1) * auVar185._32_4_ |
                       (uint)!(bool)(bVar31 & 1) * auVar76._32_4_;
                  bVar7 = (bool)(bVar31 >> 1 & 1);
                  auVar95._36_4_ = (uint)bVar7 * auVar185._36_4_ | (uint)!bVar7 * auVar76._36_4_;
                  bVar7 = (bool)(bVar31 >> 2 & 1);
                  auVar95._40_4_ = (uint)bVar7 * auVar185._40_4_ | (uint)!bVar7 * auVar76._40_4_;
                  bVar7 = (bool)(bVar31 >> 3 & 1);
                  auVar95._44_4_ = (uint)bVar7 * auVar185._44_4_ | (uint)!bVar7 * auVar76._44_4_;
                  bVar7 = (bool)(bVar31 >> 4 & 1);
                  auVar95._48_4_ = (uint)bVar7 * auVar185._48_4_ | (uint)!bVar7 * auVar76._48_4_;
                  bVar7 = (bool)(bVar31 >> 5 & 1);
                  auVar95._52_4_ = (uint)bVar7 * auVar185._52_4_ | (uint)!bVar7 * auVar76._52_4_;
                  bVar7 = (bool)(bVar31 >> 6 & 1);
                  auVar95._56_4_ = (uint)bVar7 * auVar185._56_4_ | (uint)!bVar7 * auVar76._56_4_;
                  auVar95._60_4_ =
                       (uint)(bVar31 >> 7) * auVar185._60_4_ |
                       (uint)!(bool)(bVar31 >> 7) * auVar76._60_4_;
                  auVar66 = vextractf64x4_avx512f(auVar95,1);
                  auVar185 = vaddps_avx512f(auVar95,ZEXT3264(auVar66));
                  auVar55 = vextractf32x4_avx512vl(auVar185._0_32_,1);
                  auVar58 = vaddps_avx512vl(auVar185._0_16_,auVar55);
                  auVar55 = vshufpd_avx512vl(auVar58,auVar58,1);
                  auVar58 = vaddps_avx512vl(auVar58,auVar55);
                  auVar66 = auVar185._32_32_;
                  auVar58 = vhaddps_avx(auVar58,auVar58);
                }
                auVar63 = vextractf64x4_avx512f(auVar73,1);
                auVar62 = auVar73._0_32_;
                if (iVar36 == 8) {
                  auVar67 = vaddps_avx512vl(auVar62,auVar67);
                  auVar67 = vaddps_avx512vl(auVar67,auVar63);
                  auVar65 = vmulps_avx512vl(auVar67,auVar68._0_32_);
                  in_ZMM16 = ZEXT3264(auVar65);
                }
                else {
                  auVar55 = vxorps_avx512vl(auVar55,auVar55);
                  in_ZMM16 = ZEXT1664(auVar55);
                  if (iVar36 == 0x10) {
                    in_ZMM16 = vmulps_avx512f(auVar73,auVar68);
                    auVar66 = in_ZMM16._32_32_;
                  }
                }
                if (iVar36 == 4) {
                  auVar66 = vaddps_avx512vl(auVar62,auVar67);
                  auVar67 = vaddps_avx512vl(auVar66,auVar63);
                  auVar55 = vextractf32x4_avx512vl(auVar67,1);
                  auVar55 = vaddps_avx512vl(auVar67._0_16_,auVar55);
                  auVar56 = vaddps_avx512vl(auVar55,auVar56);
                  auVar55 = vmulps_avx512vl(auVar56,auVar68._0_16_);
                  in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar55,0);
                  auVar66 = in_ZMM16._32_32_;
                }
                auVar55 = auVar67._0_16_;
                in_ZMM18 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
                if (iVar36 == 1) {
                  auVar96._0_32_ = vaddps_avx512vl(auVar62,auVar63);
                  auVar96._32_32_ = auVar66;
                  auVar98._16_48_ = auVar96._16_48_;
                  auVar57 = vextractf32x4_avx512vl(auVar96._0_32_,1);
                  auVar59 = vaddps_avx512vl(auVar96._0_16_,auVar57);
                  auVar60 = vshufpd_avx512vl(auVar59,auVar59,1);
                  auVar57 = vextractf32x4_avx512vl(auVar67,1);
                  auVar55 = vaddps_avx512vl(auVar57,auVar55);
                  auVar57 = vshufps_avx512vl(auVar55,auVar56,0x11);
                  auVar55 = vshufps_avx512vl(auVar55,auVar56,0xbb);
                  auVar55 = vaddps_avx512vl(auVar55,auVar57);
                  auVar56 = vshufpd_avx512vl(auVar55,auVar55,1);
                  auVar55 = vaddps_avx512vl(auVar55,auVar56);
                  auVar57 = vhaddps_avx(auVar55,auVar55);
                  auVar59 = vaddps_avx512vl(auVar60,auVar59);
                  auVar55 = vmovshdup_avx512vl(auVar59);
                  auVar58 = vaddss_avx512f(auVar55,auVar58);
                  auVar58 = vaddss_avx512f(auVar59,auVar58);
                  auVar98._0_16_ = in_ZMM16._0_16_;
                  auVar97._4_60_ = auVar98._4_60_;
                  auVar97._0_4_ = (auVar58._0_4_ + auVar57._0_4_) * fVar135;
                  in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar97._0_16_,0);
                }
                auVar57 = in_ZMM16._0_16_;
                auVar58 = auVar57;
                if (iVar36 != 4) {
                  auVar58 = vbroadcastss_avx512vl(auVar57);
                }
                auVar66 = in_ZMM16._0_32_;
                if (iVar36 != 8) {
                  auVar66 = vinsertf32x4_avx512vl(ZEXT1632(auVar58),auVar58,1);
                }
                auVar73 = in_ZMM16;
                if (iVar36 != 0x10) {
                  auVar73 = vinsertf64x4_avx512f(ZEXT3264(auVar66),auVar66,1);
                }
                auVar134 = auVar73._16_48_;
                pauVar37 = pauVar49;
                if ((int)uVar47 < 0x10) {
                  auVar55 = vxorps_avx512vl(auVar55,auVar55);
                  in_ZMM19 = ZEXT1664(auVar55);
                  uVar39 = 0;
                }
                else {
                  auVar55 = vxorps_avx512vl(auVar55,auVar55);
                  in_ZMM19 = ZEXT1664(auVar55);
                  iVar38 = 0x10;
                  do {
                    auVar185 = vsubps_avx512f(*pauVar37,auVar73);
                    in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar185,auVar185);
                    auVar134 = in_ZMM19._16_48_;
                    pauVar37 = pauVar37 + 1;
                    iVar38 = iVar38 + 0x10;
                    uVar39 = uVar51;
                  } while (iVar38 <= (int)uVar47);
                }
                uVar40 = uVar39 | 8;
                auVar99._0_16_ = vxorps_avx512vl(auVar56,auVar56);
                auVar99._16_48_ = auVar134;
                in_ZMM20 = ZEXT1664(auVar99._0_16_);
                auVar67 = auVar134._16_32_;
                while ((int)uVar40 <= (int)uVar47) {
                  auVar67 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar66);
                  auVar99._0_32_ = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar67,auVar67);
                  in_ZMM20 = ZEXT3264(auVar99._0_32_);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                  uVar40 = uVar39 + 0x10;
                  uVar39 = uVar39 + 8;
                  auVar67 = auVar99._32_32_;
                }
                iVar38 = uVar39 + 4;
                auVar55 = vxorps_avx512vl(auVar66._0_16_,auVar66._0_16_);
                while (iVar38 <= (int)uVar47) {
                  auVar56 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,auVar58);
                  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar56,auVar56);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = uVar39 + 8;
                  uVar39 = uVar39 + 4;
                }
                auVar56 = ZEXT816(0) << 0x40;
                if ((int)uVar39 < (int)uVar47) {
                  auVar73 = vpbroadcastq_avx512f();
                  auVar185 = vbroadcastss_avx512f(auVar57);
                  auVar58 = auVar185._0_16_;
                  auVar56 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
                  uVar46 = 0;
                  in_ZMM24 = ZEXT1664(auVar56);
                  do {
                    auVar76 = in_ZMM24;
                    auVar74 = vpbroadcastq_avx512f();
                    auVar75 = vporq_avx512f(auVar74,auVar69);
                    auVar74 = vporq_avx512f(auVar74,auVar184);
                    uVar20 = vpcmpuq_avx512f(auVar74,auVar73,2);
                    bVar30 = (byte)uVar20;
                    uVar20 = vpcmpuq_avx512f(auVar75,auVar73,2);
                    bVar31 = (byte)uVar20;
                    uVar53 = CONCAT11(bVar31,bVar30);
                    piVar1 = (int *)(*pauVar37 + uVar46 * 4);
                    auVar100._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                    auVar100._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                    auVar100._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                    auVar100._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                    auVar100._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                    auVar100._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                    auVar100._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                    auVar100._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                    auVar100._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                    auVar100._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                    auVar100._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                    auVar100._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                    auVar100._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                    auVar100._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                    auVar100._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                    auVar100._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                    auVar74 = vsubps_avx512f(auVar100,auVar185);
                    in_ZMM24 = vfmadd213ps_avx512f(auVar74,auVar74,auVar76);
                    uVar46 = uVar46 + 0x10;
                  } while (((ulong)(~uVar39 + uVar47) + 0x10 & 0x1fffffff0) != uVar46);
                  auVar101._0_4_ =
                       (uint)(bVar30 & 1) * in_ZMM24._0_4_ |
                       (uint)!(bool)(bVar30 & 1) * auVar76._0_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                  auVar101._4_4_ = (uint)bVar7 * in_ZMM24._4_4_ | (uint)!bVar7 * auVar76._4_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
                  auVar101._8_4_ = (uint)bVar7 * in_ZMM24._8_4_ | (uint)!bVar7 * auVar76._8_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                  auVar101._12_4_ = (uint)bVar7 * in_ZMM24._12_4_ | (uint)!bVar7 * auVar76._12_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
                  auVar101._16_4_ = (uint)bVar7 * in_ZMM24._16_4_ | (uint)!bVar7 * auVar76._16_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
                  auVar101._20_4_ = (uint)bVar7 * in_ZMM24._20_4_ | (uint)!bVar7 * auVar76._20_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
                  auVar101._24_4_ = (uint)bVar7 * in_ZMM24._24_4_ | (uint)!bVar7 * auVar76._24_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
                  auVar101._28_4_ = (uint)bVar7 * in_ZMM24._28_4_ | (uint)!bVar7 * auVar76._28_4_;
                  auVar101._32_4_ =
                       (uint)(bVar31 & 1) * in_ZMM24._32_4_ |
                       (uint)!(bool)(bVar31 & 1) * auVar76._32_4_;
                  bVar7 = (bool)(bVar31 >> 1 & 1);
                  auVar101._36_4_ = (uint)bVar7 * in_ZMM24._36_4_ | (uint)!bVar7 * auVar76._36_4_;
                  bVar7 = (bool)(bVar31 >> 2 & 1);
                  auVar101._40_4_ = (uint)bVar7 * in_ZMM24._40_4_ | (uint)!bVar7 * auVar76._40_4_;
                  bVar7 = (bool)(bVar31 >> 3 & 1);
                  auVar101._44_4_ = (uint)bVar7 * in_ZMM24._44_4_ | (uint)!bVar7 * auVar76._44_4_;
                  bVar7 = (bool)(bVar31 >> 4 & 1);
                  auVar101._48_4_ = (uint)bVar7 * in_ZMM24._48_4_ | (uint)!bVar7 * auVar76._48_4_;
                  bVar7 = (bool)(bVar31 >> 5 & 1);
                  auVar101._52_4_ = (uint)bVar7 * in_ZMM24._52_4_ | (uint)!bVar7 * auVar76._52_4_;
                  bVar7 = (bool)(bVar31 >> 6 & 1);
                  auVar101._56_4_ = (uint)bVar7 * in_ZMM24._56_4_ | (uint)!bVar7 * auVar76._56_4_;
                  auVar101._60_4_ =
                       (uint)(bVar31 >> 7) * in_ZMM24._60_4_ |
                       (uint)!(bool)(bVar31 >> 7) * auVar76._60_4_;
                  auVar66 = vextractf64x4_avx512f(auVar101,1);
                  auVar73 = vaddps_avx512f(auVar101,ZEXT3264(auVar66));
                  auVar67 = auVar73._32_32_;
                  auVar159._0_4_ = auVar73._0_4_ + auVar73._16_4_;
                  auVar159._4_4_ = auVar73._4_4_ + auVar73._20_4_;
                  auVar159._8_4_ = auVar73._8_4_ + auVar73._24_4_;
                  auVar159._12_4_ = auVar73._12_4_ + auVar73._28_4_;
                  auVar56 = vshufpd_avx(auVar159,auVar159,1);
                  auVar160._0_4_ = auVar159._0_4_ + auVar56._0_4_;
                  auVar160._4_4_ = auVar159._4_4_ + auVar56._4_4_;
                  auVar160._8_4_ = auVar159._8_4_ + auVar56._8_4_;
                  auVar160._12_4_ = auVar159._12_4_ + auVar56._12_4_;
                  auVar56 = vhaddps_avx(auVar160,auVar160);
                }
                auVar58 = vxorps_avx512vl(auVar58,auVar58);
                in_ZMM17 = ZEXT1664(auVar58);
                if (iVar36 == 0x10) {
                  in_ZMM17 = vmulps_avx512f(in_ZMM19,auVar68);
                  auVar67 = in_ZMM17._32_32_;
                }
                auVar102._0_32_ = vextractf64x4_avx512f(in_ZMM19,1);
                auVar102._32_32_ = auVar67;
                auVar66 = in_ZMM19._0_32_;
                auVar73 = auVar102;
                if (iVar36 == 8) {
                  auVar67 = vaddps_avx512vl(auVar66,in_ZMM20._0_32_);
                  auVar67 = vaddps_avx512vl(auVar67,auVar102._0_32_);
                  in_ZMM20 = ZEXT3264(auVar67);
                  auVar67 = vmulps_avx512vl(auVar67,auVar68._0_32_);
                  auVar73 = vinsertf64x4_avx512f(in_ZMM17,auVar67,0);
                  in_ZMM17 = auVar73;
                }
                if (iVar36 == 4) {
                  auVar67 = vaddps_avx512vl(auVar66,in_ZMM20._0_32_);
                  auVar67 = vaddps_avx512vl(auVar67,auVar102._0_32_);
                  in_ZMM20 = ZEXT3264(auVar67);
                  auVar58 = vextractf32x4_avx512vl(auVar67,1);
                  auVar58 = vaddps_avx512vl(auVar67._0_16_,auVar58);
                  auVar55 = vaddps_avx512vl(auVar58,auVar55);
                  auVar58 = vmulps_avx512vl(auVar55,auVar68._0_16_);
                  auVar73 = vinsertf32x4_avx512f(in_ZMM17,auVar58,0);
                  in_ZMM17 = auVar73;
                }
                if (iVar36 == 1) {
                  auVar103._32_32_ = auVar73._32_32_;
                  auVar103._0_32_ = vaddps_avx512vl(auVar66,auVar102._0_32_);
                  auVar105._16_48_ = auVar103._16_48_;
                  auVar58 = vextractf32x4_avx512vl(auVar103._0_32_,1);
                  auVar58 = vaddps_avx512vl(auVar103._0_16_,auVar58);
                  auVar59 = vshufpd_avx512vl(auVar58,auVar58,1);
                  auVar60 = vextractf32x4_avx512vl(in_ZMM20._0_32_,1);
                  auVar60 = vaddps_avx512vl(auVar60,in_ZMM20._0_16_);
                  auVar61 = vshufps_avx512vl(auVar60,auVar55,0x11);
                  auVar55 = vshufps_avx512vl(auVar60,auVar55,0xbb);
                  auVar55 = vaddps_avx512vl(auVar55,auVar61);
                  in_ZMM20 = ZEXT1664(auVar55);
                  auVar60 = vshufpd_avx512vl(auVar55,auVar55,1);
                  auVar55 = vaddps_avx512vl(auVar55,auVar60);
                  auVar55 = vhaddps_avx(auVar55,auVar55);
                  auVar58 = vaddps_avx512vl(auVar59,auVar58);
                  auVar59 = vmovshdup_avx512vl(auVar58);
                  in_ZMM19 = ZEXT1664(auVar59);
                  auVar56 = vaddss_avx512f(auVar59,auVar56);
                  auVar105._0_16_ = in_ZMM17._0_16_;
                  auVar104._4_60_ = auVar105._4_60_;
                  auVar104._0_4_ = (auVar58._0_4_ + auVar56._0_4_ + auVar55._0_4_) * fVar135;
                  auVar73 = vinsertf32x4_avx512f(in_ZMM17,auVar104._0_16_,0);
                  in_ZMM17 = auVar73;
                }
                auVar55 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
                if (iVar36 < 8) {
                  auVar107._16_48_ = auVar73._16_48_;
                  auVar56 = in_ZMM17._0_16_;
                  if (iVar36 == 1) {
                    auVar58 = vaddss_avx512f(auVar56,auVar55);
                    auVar55 = vrsqrtss_avx(auVar58,auVar58);
                    auVar58 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar58._0_4_ * auVar55._0_4_)),
                                                  auVar55,ZEXT416(0xc0400000));
                    auVar55 = vmulss_avx512f(auVar55,ZEXT416(0xbf000000));
                    fVar147 = auVar55._0_4_ * auVar58._0_4_;
                    auVar107._0_16_ = auVar56;
                    auVar106._4_60_ = auVar107._4_60_;
                    auVar106._0_4_ = fVar147;
                    in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar106._0_16_,0);
                    auVar109._16_48_ = in_ZMM17._16_48_;
                    auVar55 = vxorps_avx512vl(auVar57,auVar178);
                    auVar109._0_16_ = auVar57;
                    auVar108._4_60_ = auVar109._4_60_;
                    auVar108._0_4_ = fVar147 * auVar55._0_4_;
                    auVar73 = vinsertf32x4_avx512f(in_ZMM16,auVar108._0_16_,0);
                    in_ZMM16 = auVar73;
                  }
                  else if (iVar36 == 4) {
                    auVar55 = vbroadcastss_avx512vl(auVar55);
                    auVar56 = vaddps_avx512vl(auVar56,auVar55);
                    auVar55 = vrsqrtps_avx(auVar56);
                    auVar161._0_4_ = auVar56._0_4_ * auVar55._0_4_;
                    auVar161._4_4_ = auVar56._4_4_ * auVar55._4_4_;
                    auVar161._8_4_ = auVar56._8_4_ * auVar55._8_4_;
                    auVar161._12_4_ = auVar56._12_4_ * auVar55._12_4_;
                    auVar56 = vfmadd213ps_avx512vl(auVar161,auVar55,auVar54);
                    auVar162._0_4_ = auVar55._0_4_ * -0.5 * auVar56._0_4_;
                    auVar162._4_4_ = auVar55._4_4_ * -0.5 * auVar56._4_4_;
                    auVar162._8_4_ = auVar55._8_4_ * -0.5 * auVar56._8_4_;
                    auVar162._12_4_ = auVar55._12_4_ * -0.5 * auVar56._12_4_;
                    auVar55 = vxorps_avx512vl(auVar57,auVar178);
                    auVar175._0_4_ = auVar162._0_4_ * auVar55._0_4_;
                    auVar175._4_4_ = auVar162._4_4_ * auVar55._4_4_;
                    auVar175._8_4_ = auVar162._8_4_ * auVar55._8_4_;
                    auVar175._12_4_ = auVar162._12_4_ * auVar55._12_4_;
                    in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar162,0);
                    auVar73 = vinsertf32x4_avx512f(in_ZMM16,auVar175,0);
                    in_ZMM16 = auVar73;
                  }
                }
                else if (iVar36 == 8) {
                  auVar66 = vbroadcastss_avx512vl(auVar55);
                  auVar67 = vaddps_avx512vl(in_ZMM17._0_32_,auVar66);
                  auVar66 = vrsqrtps_avx(auVar67);
                  auVar32._4_4_ = auVar67._4_4_ * auVar66._4_4_;
                  auVar32._0_4_ = auVar67._0_4_ * auVar66._0_4_;
                  auVar32._8_4_ = auVar67._8_4_ * auVar66._8_4_;
                  auVar32._12_4_ = auVar67._12_4_ * auVar66._12_4_;
                  auVar32._16_4_ = auVar67._16_4_ * auVar66._16_4_;
                  auVar32._20_4_ = auVar67._20_4_ * auVar66._20_4_;
                  auVar32._24_4_ = auVar67._24_4_ * auVar66._24_4_;
                  auVar32._28_4_ = auVar67._28_4_;
                  auVar55 = vfmadd213ps_fma(auVar32,auVar66,auVar180);
                  auVar170._0_4_ = auVar66._0_4_ * -0.5 * auVar55._0_4_;
                  auVar170._4_4_ = auVar66._4_4_ * -0.5 * auVar55._4_4_;
                  auVar170._8_4_ = auVar66._8_4_ * -0.5 * auVar55._8_4_;
                  auVar170._12_4_ = auVar66._12_4_ * -0.5 * auVar55._12_4_;
                  auVar170._16_4_ = auVar66._16_4_ * -0.5 * 0.0;
                  auVar170._20_4_ = auVar66._20_4_ * -0.5 * 0.0;
                  auVar170._24_4_ = auVar66._24_4_ * -0.5 * 0.0;
                  auVar170._28_4_ = 0;
                  auVar66 = vxorps_avx512vl(in_ZMM16._0_32_,auVar182);
                  auVar33._4_4_ = auVar170._4_4_ * auVar66._4_4_;
                  auVar33._0_4_ = auVar170._0_4_ * auVar66._0_4_;
                  auVar33._8_4_ = auVar170._8_4_ * auVar66._8_4_;
                  auVar33._12_4_ = auVar170._12_4_ * auVar66._12_4_;
                  auVar33._16_4_ = auVar170._16_4_ * auVar66._16_4_;
                  auVar33._20_4_ = auVar170._20_4_ * auVar66._20_4_;
                  auVar33._24_4_ = auVar170._24_4_ * auVar66._24_4_;
                  auVar33._28_4_ = auVar66._28_4_;
                  in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar170,0);
                  auVar73 = vinsertf64x4_avx512f(in_ZMM16,auVar33,0);
                  in_ZMM16 = auVar73;
                }
                else if (iVar36 == 0x10) {
                  auVar73 = vbroadcastss_avx512f(auVar55);
                  auVar73 = vaddps_avx512f(in_ZMM17,auVar73);
                  auVar185 = vrsqrt14ps_avx512f(auVar73);
                  auVar73 = vmulps_avx512f(auVar73,auVar185);
                  auVar73 = vfmadd213ps_avx512f(auVar73,auVar185,auVar70);
                  auVar185 = vmulps_avx512f(auVar185,auVar71);
                  in_ZMM17 = vmulps_avx512f(auVar185,auVar73);
                  auVar73 = vxorps_avx512dq(in_ZMM16,auVar72);
                  auVar73 = vmulps_avx512f(in_ZMM17,auVar73);
                  in_ZMM16 = auVar73;
                }
                auVar56 = in_ZMM17._0_16_;
                auVar66 = in_ZMM17._0_32_;
                auVar55 = in_ZMM16._0_16_;
                auVar67 = in_ZMM16._0_32_;
                if (*(int *)(&this->field_0xd8 + (long)pp_Var5[-3]) == 0) {
                  auVar58 = auVar56;
                  if (iVar36 != 4) {
                    auVar58 = vbroadcastss_avx512vl(auVar56);
                  }
                  in_ZMM18 = ZEXT1664(auVar58);
                  auVar57 = auVar55;
                  if (iVar36 != 4) {
                    auVar57 = vbroadcastss_avx512vl(auVar55);
                  }
                  in_ZMM19 = ZEXT1664(auVar57);
                  if (iVar36 != 8) {
                    auVar66 = vinsertf32x4_avx512vl(ZEXT1632(auVar58),auVar58,1);
                  }
                  in_ZMM20 = ZEXT3264(auVar66);
                  if (iVar36 != 8) {
                    auVar67 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
                  }
                  auVar185 = in_ZMM16;
                  auVar74 = in_ZMM17;
                  if (iVar36 != 0x10) {
                    auVar74 = vinsertf64x4_avx512f(in_ZMM20,auVar66,1);
                    auVar185 = vinsertf64x4_avx512f(ZEXT3264(auVar67),auVar67,1);
                  }
                  auVar73 = auVar185;
                  uVar39 = 0;
                  if (0xf < (int)uVar47) {
                    iVar38 = 0x10;
                    do {
                      auVar73 = vfmadd132ps_avx512f(*pauVar49,auVar185,auVar74);
                      *pauVar49 = auVar73;
                      pauVar49 = pauVar49 + 1;
                      iVar38 = iVar38 + 0x10;
                      uVar39 = uVar51;
                    } while (iVar38 <= (int)uVar47);
                  }
                  uVar40 = uVar39 | 8;
                  while ((int)uVar40 <= (int)uVar47) {
                    auVar73._0_32_ =
                         vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar67,auVar66);
                    *(undefined1 (*) [32])*pauVar49 = auVar73._0_32_;
                    pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                    uVar40 = uVar39 + 0x10;
                    uVar39 = uVar39 + 8;
                  }
                  iVar38 = uVar39 + 4;
                  while (iVar38 <= (int)uVar47) {
                    auVar73._0_16_ =
                         vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar57,auVar58);
                    *(undefined1 (*) [16])*pauVar49 = auVar73._0_16_;
                    pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                    iVar38 = uVar39 + 8;
                    uVar39 = uVar39 + 4;
                  }
                  if ((int)uVar39 < (int)uVar47) {
                    auVar185 = vpbroadcastq_avx512f();
                    in_ZMM17 = vbroadcastss_avx512f(auVar56);
                    in_ZMM16 = vbroadcastss_avx512f(auVar55);
                    uVar46 = 0;
                    do {
                      auVar73 = vpbroadcastq_avx512f();
                      auVar74 = vporq_avx512f(auVar73,auVar69);
                      auVar73 = vporq_avx512f(auVar73,auVar184);
                      uVar20 = vpcmpuq_avx512f(auVar73,auVar185,2);
                      bVar30 = (byte)uVar20;
                      uVar20 = vpcmpuq_avx512f(auVar74,auVar185,2);
                      bVar31 = (byte)uVar20;
                      uVar53 = CONCAT11(bVar31,bVar30);
                      piVar1 = (int *)(*pauVar49 + uVar46 * 4);
                      auVar112._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                      auVar112._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                      auVar112._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                      auVar112._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                      auVar112._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                      auVar112._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                      auVar112._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                      auVar112._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                      auVar112._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                      auVar112._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                      auVar112._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                      auVar112._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                      auVar112._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                      auVar112._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                      auVar112._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                      auVar112._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                      auVar75 = vfmadd213ps_avx512f(auVar112,in_ZMM17,in_ZMM16);
                      auVar74 = *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4);
                      auVar73._0_4_ =
                           (uint)(bVar30 & 1) * auVar75._0_4_ |
                           (uint)!(bool)(bVar30 & 1) * auVar74._0_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                      auVar73._4_4_ = (uint)bVar7 * auVar75._4_4_ | (uint)!bVar7 * auVar74._4_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
                      auVar73._8_4_ = (uint)bVar7 * auVar75._8_4_ | (uint)!bVar7 * auVar74._8_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                      auVar73._12_4_ = (uint)bVar7 * auVar75._12_4_ | (uint)!bVar7 * auVar74._12_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
                      auVar73._16_4_ = (uint)bVar7 * auVar75._16_4_ | (uint)!bVar7 * auVar74._16_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
                      auVar73._20_4_ = (uint)bVar7 * auVar75._20_4_ | (uint)!bVar7 * auVar74._20_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
                      auVar73._24_4_ = (uint)bVar7 * auVar75._24_4_ | (uint)!bVar7 * auVar74._24_4_;
                      bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
                      auVar73._28_4_ = (uint)bVar7 * auVar75._28_4_ | (uint)!bVar7 * auVar74._28_4_;
                      auVar73._32_4_ =
                           (uint)(bVar31 & 1) * auVar75._32_4_ |
                           (uint)!(bool)(bVar31 & 1) * auVar74._32_4_;
                      bVar7 = (bool)(bVar31 >> 1 & 1);
                      auVar73._36_4_ = (uint)bVar7 * auVar75._36_4_ | (uint)!bVar7 * auVar74._36_4_;
                      bVar7 = (bool)(bVar31 >> 2 & 1);
                      auVar73._40_4_ = (uint)bVar7 * auVar75._40_4_ | (uint)!bVar7 * auVar74._40_4_;
                      bVar7 = (bool)(bVar31 >> 3 & 1);
                      auVar73._44_4_ = (uint)bVar7 * auVar75._44_4_ | (uint)!bVar7 * auVar74._44_4_;
                      bVar7 = (bool)(bVar31 >> 4 & 1);
                      auVar73._48_4_ = (uint)bVar7 * auVar75._48_4_ | (uint)!bVar7 * auVar74._48_4_;
                      bVar7 = (bool)(bVar31 >> 5 & 1);
                      auVar73._52_4_ = (uint)bVar7 * auVar75._52_4_ | (uint)!bVar7 * auVar74._52_4_;
                      bVar7 = (bool)(bVar31 >> 6 & 1);
                      auVar73._56_4_ = (uint)bVar7 * auVar75._56_4_ | (uint)!bVar7 * auVar74._56_4_;
                      auVar73._60_4_ =
                           (uint)(bVar31 >> 7) * auVar75._60_4_ |
                           (uint)!(bool)(bVar31 >> 7) * auVar74._60_4_;
                      *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4) = auVar73;
                      uVar46 = uVar46 + 0x10;
                    } while (((ulong)(~uVar39 + uVar47) + 0x10 & 0x1fffffff0) != uVar46);
                  }
                }
                else {
                  pauVar37 = pauVar43;
                  pauVar41 = pauVar50;
                  if (0xf < (int)uVar47 && iVar36 == 0x10) {
                    iVar38 = 0x10;
                    do {
                      auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar37));
                      auVar185 = vfmadd132ps_avx512f(*pauVar49,in_ZMM16,in_ZMM17);
                      uVar3 = *(undefined4 *)*pauVar41;
                      auVar27._4_4_ = uVar3;
                      auVar27._0_4_ = uVar3;
                      auVar27._8_4_ = uVar3;
                      auVar27._12_4_ = uVar3;
                      auVar27._16_4_ = uVar3;
                      auVar27._20_4_ = uVar3;
                      auVar27._24_4_ = uVar3;
                      auVar27._28_4_ = uVar3;
                      auVar27._32_4_ = uVar3;
                      auVar27._36_4_ = uVar3;
                      auVar27._40_4_ = uVar3;
                      auVar27._44_4_ = uVar3;
                      auVar27._48_4_ = uVar3;
                      auVar27._52_4_ = uVar3;
                      auVar27._56_4_ = uVar3;
                      auVar27._60_4_ = uVar3;
                      auVar73 = vfmadd213ps_avx512f(auVar185,auVar73,auVar27);
                      *pauVar49 = auVar73;
                      pauVar49 = pauVar49 + 1;
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                      iVar38 = iVar38 + 0x10;
                    } while (iVar38 <= (int)uVar47);
                  }
                  if (iVar36 == 8) {
                    uVar39 = 8;
                    if (0xf < (int)uVar47) {
                      auVar185 = vinsertf64x4_avx512f(in_ZMM17,auVar66,1);
                      in_ZMM18 = vinsertf64x4_avx512f(in_ZMM16,auVar67,1);
                      iVar38 = 0x10;
                      do {
                        in_ZMM20 = ZEXT464(*(uint *)(*pauVar41 + 4));
                        auVar73 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar136,
                                                    ZEXT464(*(uint *)(*pauVar37 + 4)));
                        in_ZMM19 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar41),auVar136,in_ZMM20);
                        auVar74 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar185);
                        auVar73 = vfmadd213ps_avx512f(auVar74,auVar73,in_ZMM19);
                        *pauVar49 = auVar73;
                        pauVar49 = pauVar49 + 1;
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                        pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                        iVar38 = iVar38 + 0x10;
                        uVar39 = uVar47 | 8;
                      } while (iVar38 <= (int)uVar47);
                    }
                    for (; (int)uVar39 <= (int)uVar47; uVar39 = uVar39 + 8) {
                      uVar3 = *(undefined4 *)*pauVar37;
                      auVar171._4_4_ = uVar3;
                      auVar171._0_4_ = uVar3;
                      auVar171._8_4_ = uVar3;
                      auVar171._12_4_ = uVar3;
                      auVar171._16_4_ = uVar3;
                      auVar171._20_4_ = uVar3;
                      auVar171._24_4_ = uVar3;
                      auVar171._28_4_ = uVar3;
                      auVar63 = vfmadd132ps_avx512vl
                                          (*(undefined1 (*) [32])*pauVar49,auVar67,auVar66);
                      uVar3 = *(undefined4 *)*pauVar41;
                      auVar25._4_4_ = uVar3;
                      auVar25._0_4_ = uVar3;
                      auVar25._8_4_ = uVar3;
                      auVar25._12_4_ = uVar3;
                      auVar25._16_4_ = uVar3;
                      auVar25._20_4_ = uVar3;
                      auVar25._24_4_ = uVar3;
                      auVar25._28_4_ = uVar3;
                      auVar73._0_32_ = vfmadd213ps_avx512vl(auVar63,auVar171,auVar25);
                      *(undefined1 (*) [32])*pauVar49 = auVar73._0_32_;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                    }
                  }
                  if (iVar36 == 4) {
                    uVar39 = 0;
                    if (0xf < (int)uVar47) {
                      auVar73 = vinsertf64x4_avx512f(in_ZMM17,auVar66,1);
                      auVar185 = vpermpd_avx512f(auVar73,0x44);
                      auVar73 = vinsertf64x4_avx512f(in_ZMM16,auVar67,1);
                      in_ZMM18 = vpermpd_avx512f(auVar73,0x44);
                      iVar38 = 0x10;
                      do {
                        auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                        auVar74 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                        auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                                   ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                        auVar63 = vpermpd_avx512vl(ZEXT1632(auVar58),0x50);
                        auVar73 = vinsertf64x4_avx512f(auVar73,auVar63,0);
                        auVar75 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 8)));
                        in_ZMM20 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 0xc)));
                        auVar110._0_48_ = auVar73._0_48_;
                        auVar110._48_8_ = auVar74._48_8_;
                        auVar110._56_8_ = auVar74._56_8_;
                        auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar41),
                                                   ZEXT416(*(uint *)(*pauVar41 + 4)),0);
                        auVar63 = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                        auVar73 = vinsertf64x4_avx512f(auVar75,auVar63,0);
                        auVar111._0_48_ = auVar73._0_48_;
                        auVar111._48_8_ = in_ZMM20._48_8_;
                        auVar111._56_8_ = in_ZMM20._56_8_;
                        auVar73 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar185);
                        auVar73 = vfmadd213ps_avx512f(auVar73,auVar110,auVar111);
                        *pauVar49 = auVar73;
                        pauVar49 = pauVar49 + 1;
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                        pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
                        iVar38 = iVar38 + 0x10;
                        in_ZMM19 = auVar73;
                        uVar39 = uVar51;
                      } while (iVar38 <= (int)uVar47);
                    }
                    if ((int)(uVar39 | 8) <= (int)uVar47) {
                      auVar113._32_32_ = auVar73._32_32_;
                      auVar66 = vpermpd_avx512vl(auVar66,0x44);
                      auVar113._0_32_ = vpermpd_avx512vl(auVar67,0x44);
                      in_ZMM18 = ZEXT3264(auVar113._0_32_);
                      auVar73 = auVar113;
                      uVar40 = uVar39;
                      do {
                        auVar58 = vshufps_avx(ZEXT416(*(uint *)*pauVar37),
                                              ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                        auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar41),
                                                   ZEXT416(*(uint *)(*pauVar41 + 4)),0);
                        auVar67 = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                        auVar63 = vpermpd_avx2(ZEXT1632(auVar57),0x50);
                        auVar62 = vfmadd132ps_avx512vl
                                            (*(undefined1 (*) [32])*pauVar49,auVar113._0_32_,auVar66
                                            );
                        auVar73._0_32_ = vfmadd213ps_avx512vl(auVar62,auVar67,auVar63);
                        in_ZMM19 = ZEXT3264(auVar73._0_32_);
                        *(undefined1 (*) [32])*pauVar49 = auVar73._0_32_;
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                        pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                        uVar39 = uVar40 + 8;
                        iVar38 = uVar40 + 0x10;
                        uVar40 = uVar39;
                      } while (iVar38 <= (int)uVar47);
                    }
                    while (uVar39 = uVar39 + 4, (int)uVar39 <= (int)uVar47) {
                      uVar3 = *(undefined4 *)*pauVar37;
                      auVar163._4_4_ = uVar3;
                      auVar163._0_4_ = uVar3;
                      auVar163._8_4_ = uVar3;
                      auVar163._12_4_ = uVar3;
                      auVar58 = vfmadd132ps_avx512vl
                                          (*(undefined1 (*) [16])*pauVar49,auVar55,auVar56);
                      uVar3 = *(undefined4 *)*pauVar41;
                      auVar21._4_4_ = uVar3;
                      auVar21._0_4_ = uVar3;
                      auVar21._8_4_ = uVar3;
                      auVar21._12_4_ = uVar3;
                      auVar73._0_16_ = vfmadd213ps_avx512vl(auVar58,auVar163,auVar21);
                      *(undefined1 (*) [16])*pauVar49 = auVar73._0_16_;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                    }
                  }
                  if (iVar36 == 1) {
                    in_ZMM18 = vbroadcastss_avx512f(auVar56);
                    in_ZMM19 = vbroadcastss_avx512f(auVar55);
                    auVar73 = in_ZMM19;
                    uVar39 = 0;
                    if (0xf < (int)uVar47) {
                      iVar38 = 0x10;
                      do {
                        auVar73 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,in_ZMM18);
                        auVar73 = vfmadd213ps_avx512f(auVar73,*pauVar37,*pauVar41);
                        *pauVar49 = auVar73;
                        pauVar49 = pauVar49 + 1;
                        pauVar37 = pauVar37 + 1;
                        pauVar41 = pauVar41 + 1;
                        iVar38 = iVar38 + 0x10;
                        uVar39 = uVar51;
                      } while (iVar38 <= (int)uVar47);
                    }
                    uVar40 = uVar39 | 8;
                    while ((int)uVar40 <= (int)uVar47) {
                      auVar73._0_32_ =
                           vfmadd132ps_avx512vl
                                     (*(undefined1 (*) [32])*pauVar49,in_ZMM19._0_32_,
                                      in_ZMM18._0_32_);
                      auVar58 = vfmadd213ps_fma(auVar73._0_32_,*(undefined1 (*) [32])*pauVar37,
                                                *(undefined1 (*) [32])*pauVar41);
                      *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar58);
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x20);
                      uVar40 = uVar39 + 0x10;
                      uVar39 = uVar39 + 8;
                    }
                    iVar38 = uVar39 + 4;
                    while (iVar38 <= (int)uVar47) {
                      auVar73._0_16_ =
                           vfmadd132ps_avx512vl
                                     (*(undefined1 (*) [16])*pauVar49,in_ZMM19._0_16_,
                                      in_ZMM18._0_16_);
                      auVar58 = vfmadd213ps_fma(auVar73._0_16_,*(undefined1 (*) [16])*pauVar37,
                                                *(undefined1 (*) [16])*pauVar41);
                      *(undefined1 (*) [16])*pauVar49 = auVar58;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
                      iVar38 = uVar39 + 8;
                      uVar39 = uVar39 + 4;
                    }
                    if (uVar47 - uVar39 != 0 && (int)uVar39 <= (int)uVar47) {
                      lVar52 = 0;
                      do {
                        auVar73._0_16_ =
                             vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar52 * 4)),auVar55,
                                                 auVar56);
                        auVar58 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar37 + lVar52 * 4)),
                                                  auVar73._0_16_,
                                                  ZEXT416(*(uint *)(*pauVar41 + lVar52 * 4)));
                        *(int *)(*pauVar49 + lVar52 * 4) = auVar58._0_4_;
                        lVar52 = lVar52 + 1;
                      } while (uVar47 - uVar39 != (int)lVar52);
                    }
                  }
                }
                uVar42 = uVar42 + 1;
              } while (uVar42 != uVar45);
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar44);
        }
      }
      else if (0 < (int)uVar44) {
        pp_Var5 = this->_vptr_LayerNorm_x86_avx512;
        uVar47 = uVar45 * iVar4 * iVar36;
        fVar135 = 1.0 / (float)(int)(uVar45 * iVar4);
        auVar68 = vbroadcastss_avx512f(ZEXT416((uint)fVar135));
        uVar45 = uVar47 & 0xfffffff0;
        uVar48 = 0;
        auVar69 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar184 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar179._8_4_ = 0x80000000;
        auVar179._0_8_ = 0x8000000080000000;
        auVar179._12_4_ = 0x80000000;
        auVar54 = vbroadcastss_avx512vl(ZEXT416(0xc0400000));
        auVar181._8_4_ = 0xc0400000;
        auVar181._0_8_ = 0xc0400000c0400000;
        auVar181._12_4_ = 0xc0400000;
        auVar181._16_4_ = 0xc0400000;
        auVar181._20_4_ = 0xc0400000;
        auVar181._24_4_ = 0xc0400000;
        auVar181._28_4_ = 0xc0400000;
        auVar183._8_4_ = 0x80000000;
        auVar183._0_8_ = 0x8000000080000000;
        auVar183._12_4_ = 0x80000000;
        auVar183._16_4_ = 0x80000000;
        auVar183._20_4_ = 0x80000000;
        auVar183._24_4_ = 0x80000000;
        auVar183._28_4_ = 0x80000000;
        auVar71 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
        auVar72 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
        auVar73 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar70 = auVar73;
        do {
          auVar58 = in_ZMM20._0_16_;
          auVar56 = in_ZMM16._0_16_;
          pauVar49 = (undefined1 (*) [64])
                     (bottom_top_blob->cstep * uVar48 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar134 = auVar70._16_48_;
          auVar55 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          auVar70 = ZEXT1664(auVar55);
          pauVar37 = pauVar49;
          uVar51 = 0;
          if (0xf < (int)uVar47) {
            iVar38 = 0x10;
            do {
              auVar70 = vaddps_avx512f(auVar70,*pauVar37);
              auVar134 = auVar70._16_48_;
              pauVar37 = pauVar37 + 1;
              iVar38 = iVar38 + 0x10;
              uVar51 = uVar45;
            } while (iVar38 <= (int)uVar47);
          }
          uVar39 = uVar51 | 8;
          auVar114._0_16_ = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          auVar114._16_48_ = auVar134;
          auVar185 = ZEXT1664(auVar114._0_16_);
          auVar66 = ZEXT1632(auVar114._0_16_);
          auVar67 = auVar134._16_32_;
          while ((int)uVar39 <= (int)uVar47) {
            auVar114._0_32_ = vaddps_avx512vl(auVar185._0_32_,*(undefined1 (*) [32])*pauVar37);
            auVar185 = ZEXT3264(auVar114._0_32_);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
            uVar39 = uVar51 + 0x10;
            uVar51 = uVar51 + 8;
            auVar66 = auVar114._0_32_;
            auVar67 = auVar114._32_32_;
          }
          iVar38 = uVar51 + 4;
          auVar55 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          while (iVar38 <= (int)uVar47) {
            auVar55 = vaddps_avx512vl(auVar55,*(undefined1 (*) [16])*pauVar37);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
            iVar38 = uVar51 + 8;
            uVar51 = uVar51 + 4;
          }
          auVar57 = ZEXT816(0) << 0x40;
          if ((int)uVar51 < (int)uVar47) {
            auVar74 = vpbroadcastq_avx512f();
            auVar56 = vxorps_avx512vl(auVar58,auVar58);
            uVar42 = 0;
            auVar185 = ZEXT1664(auVar56);
            do {
              auVar76 = auVar185;
              auVar185 = vpbroadcastq_avx512f();
              auVar75 = vporq_avx512f(auVar185,auVar69);
              auVar185 = vporq_avx512f(auVar185,auVar184);
              uVar20 = vpcmpuq_avx512f(auVar185,auVar74,2);
              bVar30 = (byte)uVar20;
              uVar20 = vpcmpuq_avx512f(auVar75,auVar74,2);
              bVar31 = (byte)uVar20;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar37 + uVar42 * 4);
              auVar115._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar115._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar115._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar115._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar115._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar115._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar115._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar115._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar115._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar115._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar115._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar115._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar115._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar115._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar115._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar115._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar185 = vaddps_avx512f(auVar115,auVar76);
              auVar58 = auVar185._0_16_;
              uVar42 = uVar42 + 0x10;
            } while (((ulong)(~uVar51 + uVar47) + 0x10 & 0x1fffffff0) != uVar42);
            auVar116._0_4_ =
                 (uint)(bVar30 & 1) * auVar185._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar76._0_4_;
            bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
            auVar116._4_4_ = (uint)bVar7 * auVar185._4_4_ | (uint)!bVar7 * auVar76._4_4_;
            bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
            auVar116._8_4_ = (uint)bVar7 * auVar185._8_4_ | (uint)!bVar7 * auVar76._8_4_;
            bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
            auVar116._12_4_ = (uint)bVar7 * auVar185._12_4_ | (uint)!bVar7 * auVar76._12_4_;
            bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
            auVar116._16_4_ = (uint)bVar7 * auVar185._16_4_ | (uint)!bVar7 * auVar76._16_4_;
            bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
            auVar116._20_4_ = (uint)bVar7 * auVar185._20_4_ | (uint)!bVar7 * auVar76._20_4_;
            bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
            auVar116._24_4_ = (uint)bVar7 * auVar185._24_4_ | (uint)!bVar7 * auVar76._24_4_;
            bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
            auVar116._28_4_ = (uint)bVar7 * auVar185._28_4_ | (uint)!bVar7 * auVar76._28_4_;
            auVar116._32_4_ =
                 (uint)(bVar31 & 1) * auVar185._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar76._32_4_;
            bVar7 = (bool)(bVar31 >> 1 & 1);
            auVar116._36_4_ = (uint)bVar7 * auVar185._36_4_ | (uint)!bVar7 * auVar76._36_4_;
            bVar7 = (bool)(bVar31 >> 2 & 1);
            auVar116._40_4_ = (uint)bVar7 * auVar185._40_4_ | (uint)!bVar7 * auVar76._40_4_;
            bVar7 = (bool)(bVar31 >> 3 & 1);
            auVar116._44_4_ = (uint)bVar7 * auVar185._44_4_ | (uint)!bVar7 * auVar76._44_4_;
            bVar7 = (bool)(bVar31 >> 4 & 1);
            auVar116._48_4_ = (uint)bVar7 * auVar185._48_4_ | (uint)!bVar7 * auVar76._48_4_;
            bVar7 = (bool)(bVar31 >> 5 & 1);
            auVar116._52_4_ = (uint)bVar7 * auVar185._52_4_ | (uint)!bVar7 * auVar76._52_4_;
            bVar7 = (bool)(bVar31 >> 6 & 1);
            auVar116._56_4_ = (uint)bVar7 * auVar185._56_4_ | (uint)!bVar7 * auVar76._56_4_;
            auVar116._60_4_ =
                 (uint)(bVar31 >> 7) * auVar185._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar76._60_4_
            ;
            auVar67 = vextractf64x4_avx512f(auVar116,1);
            auVar185 = vaddps_avx512f(auVar116,ZEXT3264(auVar67));
            auVar67 = auVar185._32_32_;
            auVar56 = vextractf32x4_avx512vl(auVar185._0_32_,1);
            auVar57 = vaddps_avx512vl(auVar185._0_16_,auVar56);
            auVar56 = vshufpd_avx512vl(auVar57,auVar57,1);
            auVar57 = vaddps_avx512vl(auVar57,auVar56);
            auVar57 = vhaddps_avx(auVar57,auVar57);
          }
          auVar63 = auVar70._0_32_;
          if (iVar36 == 8) {
            auVar62 = vextractf64x4_avx512f(auVar70,1);
            auVar66 = vaddps_avx512vl(auVar63,auVar66);
            auVar66 = vaddps_avx512vl(auVar66,auVar62);
            auVar62 = vmulps_avx512vl(auVar66,auVar68._0_32_);
            in_ZMM16 = ZEXT3264(auVar62);
          }
          else {
            auVar56 = vxorps_avx512vl(auVar56,auVar56);
            in_ZMM16 = ZEXT1664(auVar56);
            if (iVar36 == 0x10) {
              in_ZMM16 = vmulps_avx512f(auVar70,auVar68);
              auVar67 = in_ZMM16._32_32_;
            }
          }
          if (iVar36 == 4) {
            auVar67 = vextractf64x4_avx512f(auVar70,1);
            auVar66 = vaddps_avx512vl(auVar63,auVar66);
            auVar66 = vaddps_avx512vl(auVar66,auVar67);
            auVar56 = vextractf32x4_avx512vl(auVar66,1);
            auVar56 = vaddps_avx512vl(auVar66._0_16_,auVar56);
            auVar55 = vaddps_avx512vl(auVar56,auVar55);
            auVar58 = vmulps_avx512vl(auVar55,auVar68._0_16_);
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar58,0);
            auVar67 = in_ZMM16._32_32_;
          }
          if (iVar36 == 1) {
            auVar62 = vextractf64x4_avx512f(auVar70,1);
            auVar117._0_32_ = vaddps_avx512vl(auVar63,auVar62);
            auVar117._32_32_ = auVar67;
            auVar119._16_48_ = auVar117._16_48_;
            auVar56 = vextractf32x4_avx512vl(auVar117._0_32_,1);
            auVar59 = vaddps_avx512vl(auVar117._0_16_,auVar56);
            auVar58 = vshufpd_avx512vl(auVar59,auVar59,1);
            auVar56 = vextractf32x4_avx512vl(auVar66,1);
            auVar56 = vaddps_avx512vl(auVar56,auVar66._0_16_);
            auVar60 = vshufps_avx512vl(auVar56,auVar55,0x11);
            auVar55 = vshufps_avx512vl(auVar56,auVar55,0xbb);
            auVar56 = vaddps_avx512vl(auVar55,auVar60);
            auVar55 = vshufpd_avx512vl(auVar56,auVar56,1);
            auVar56 = vaddps_avx512vl(auVar56,auVar55);
            auVar56 = vhaddps_avx(auVar56,auVar56);
            auVar59 = vaddps_avx512vl(auVar58,auVar59);
            auVar60 = vmovshdup_avx512vl(auVar59);
            auVar57 = vaddss_avx512f(auVar60,auVar57);
            auVar57 = vaddss_avx512f(auVar59,auVar57);
            auVar119._0_16_ = in_ZMM16._0_16_;
            auVar118._4_60_ = auVar119._4_60_;
            auVar118._0_4_ = (auVar57._0_4_ + auVar56._0_4_) * fVar135;
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar118._0_16_,0);
          }
          in_ZMM18 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
          auVar57 = in_ZMM16._0_16_;
          auVar56 = auVar57;
          if (iVar36 != 4) {
            auVar56 = vbroadcastss_avx512vl(auVar57);
          }
          auVar66 = in_ZMM16._0_32_;
          if (iVar36 != 8) {
            auVar66 = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar56,1);
          }
          auVar70 = in_ZMM16;
          if (iVar36 != 0x10) {
            auVar70 = vinsertf64x4_avx512f(ZEXT3264(auVar66),auVar66,1);
          }
          auVar134 = auVar70._16_48_;
          pauVar37 = pauVar49;
          if ((int)uVar47 < 0x10) {
            auVar55 = vxorps_avx512vl(auVar55,auVar55);
            in_ZMM19 = ZEXT1664(auVar55);
            uVar51 = 0;
          }
          else {
            auVar55 = vxorps_avx512vl(auVar55,auVar55);
            in_ZMM19 = ZEXT1664(auVar55);
            iVar38 = 0x10;
            do {
              auVar185 = vsubps_avx512f(*pauVar37,auVar70);
              in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar185,auVar185);
              auVar134 = in_ZMM19._16_48_;
              pauVar37 = pauVar37 + 1;
              iVar38 = iVar38 + 0x10;
              uVar51 = uVar45;
            } while (iVar38 <= (int)uVar47);
          }
          uVar39 = uVar51 | 8;
          auVar120._0_16_ = vxorps_avx512vl(auVar58,auVar58);
          auVar120._16_48_ = auVar134;
          in_ZMM20 = ZEXT1664(auVar120._0_16_);
          while ((int)uVar39 <= (int)uVar47) {
            auVar67 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar66);
            auVar120._0_32_ = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar67,auVar67);
            auVar134 = auVar120._16_48_;
            in_ZMM20 = ZEXT3264(auVar120._0_32_);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
            uVar39 = uVar51 + 0x10;
            uVar51 = uVar51 + 8;
          }
          iVar38 = uVar51 + 4;
          auVar55 = vxorps_avx512vl(auVar66._0_16_,auVar66._0_16_);
          while (iVar38 <= (int)uVar47) {
            auVar58 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,auVar56);
            auVar55 = vfmadd231ps_avx512vl(auVar55,auVar58,auVar58);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
            iVar38 = uVar51 + 8;
            uVar51 = uVar51 + 4;
          }
          auVar58 = ZEXT816(0) << 0x40;
          if ((int)uVar51 < (int)uVar47) {
            auVar70 = vpbroadcastq_avx512f();
            auVar185 = vbroadcastss_avx512f(auVar57);
            auVar56 = auVar185._0_16_;
            auVar58 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
            uVar42 = 0;
            in_ZMM24 = ZEXT1664(auVar58);
            do {
              auVar76 = in_ZMM24;
              auVar74 = vpbroadcastq_avx512f();
              auVar75 = vporq_avx512f(auVar74,auVar69);
              auVar74 = vporq_avx512f(auVar74,auVar184);
              uVar20 = vpcmpuq_avx512f(auVar74,auVar70,2);
              bVar30 = (byte)uVar20;
              uVar20 = vpcmpuq_avx512f(auVar75,auVar70,2);
              bVar31 = (byte)uVar20;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar37 + uVar42 * 4);
              auVar121._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar121._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar121._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar121._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar121._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar121._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar121._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar121._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar121._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar121._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar121._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar121._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar121._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar121._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar121._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar121._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar74 = vsubps_avx512f(auVar121,auVar185);
              in_ZMM24 = vfmadd213ps_avx512f(auVar74,auVar74,auVar76);
              uVar42 = uVar42 + 0x10;
            } while (((ulong)(~uVar51 + uVar47) + 0x10 & 0x1fffffff0) != uVar42);
            auVar122._0_4_ =
                 (uint)(bVar30 & 1) * in_ZMM24._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar76._0_4_;
            bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
            auVar122._4_4_ = (uint)bVar7 * in_ZMM24._4_4_ | (uint)!bVar7 * auVar76._4_4_;
            bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
            auVar122._8_4_ = (uint)bVar7 * in_ZMM24._8_4_ | (uint)!bVar7 * auVar76._8_4_;
            bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
            auVar122._12_4_ = (uint)bVar7 * in_ZMM24._12_4_ | (uint)!bVar7 * auVar76._12_4_;
            bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
            auVar122._16_4_ = (uint)bVar7 * in_ZMM24._16_4_ | (uint)!bVar7 * auVar76._16_4_;
            bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
            auVar122._20_4_ = (uint)bVar7 * in_ZMM24._20_4_ | (uint)!bVar7 * auVar76._20_4_;
            bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
            auVar122._24_4_ = (uint)bVar7 * in_ZMM24._24_4_ | (uint)!bVar7 * auVar76._24_4_;
            bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
            auVar122._28_4_ = (uint)bVar7 * in_ZMM24._28_4_ | (uint)!bVar7 * auVar76._28_4_;
            auVar122._32_4_ =
                 (uint)(bVar31 & 1) * in_ZMM24._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar76._32_4_;
            bVar7 = (bool)(bVar31 >> 1 & 1);
            auVar122._36_4_ = (uint)bVar7 * in_ZMM24._36_4_ | (uint)!bVar7 * auVar76._36_4_;
            bVar7 = (bool)(bVar31 >> 2 & 1);
            auVar122._40_4_ = (uint)bVar7 * in_ZMM24._40_4_ | (uint)!bVar7 * auVar76._40_4_;
            bVar7 = (bool)(bVar31 >> 3 & 1);
            auVar122._44_4_ = (uint)bVar7 * in_ZMM24._44_4_ | (uint)!bVar7 * auVar76._44_4_;
            bVar7 = (bool)(bVar31 >> 4 & 1);
            auVar122._48_4_ = (uint)bVar7 * in_ZMM24._48_4_ | (uint)!bVar7 * auVar76._48_4_;
            bVar7 = (bool)(bVar31 >> 5 & 1);
            auVar122._52_4_ = (uint)bVar7 * in_ZMM24._52_4_ | (uint)!bVar7 * auVar76._52_4_;
            bVar7 = (bool)(bVar31 >> 6 & 1);
            auVar122._56_4_ = (uint)bVar7 * in_ZMM24._56_4_ | (uint)!bVar7 * auVar76._56_4_;
            auVar122._60_4_ =
                 (uint)(bVar31 >> 7) * in_ZMM24._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar76._60_4_
            ;
            auVar66 = vextractf64x4_avx512f(auVar122,1);
            auVar70 = vaddps_avx512f(auVar122,ZEXT3264(auVar66));
            auVar134 = auVar70._16_48_;
            auVar164._0_4_ = auVar70._0_4_ + auVar70._16_4_;
            auVar164._4_4_ = auVar70._4_4_ + auVar70._20_4_;
            auVar164._8_4_ = auVar70._8_4_ + auVar70._24_4_;
            auVar164._12_4_ = auVar70._12_4_ + auVar70._28_4_;
            auVar58 = vshufpd_avx(auVar164,auVar164,1);
            auVar165._0_4_ = auVar164._0_4_ + auVar58._0_4_;
            auVar165._4_4_ = auVar164._4_4_ + auVar58._4_4_;
            auVar165._8_4_ = auVar164._8_4_ + auVar58._8_4_;
            auVar165._12_4_ = auVar164._12_4_ + auVar58._12_4_;
            auVar58 = vhaddps_avx(auVar165,auVar165);
          }
          auVar70._0_16_ = vxorps_avx512vl(auVar56,auVar56);
          auVar70._16_48_ = auVar134;
          in_ZMM17 = ZEXT1664(auVar70._0_16_);
          if (iVar36 == 0x10) {
            auVar70 = vmulps_avx512f(in_ZMM19,auVar68);
            in_ZMM17 = auVar70;
          }
          auVar66 = in_ZMM19._0_32_;
          if (iVar36 == 8) {
            auVar67 = vextractf64x4_avx512f(in_ZMM19,1);
            auVar63 = vaddps_avx512vl(auVar66,in_ZMM20._0_32_);
            auVar67 = vaddps_avx512vl(auVar63,auVar67);
            in_ZMM20 = ZEXT3264(auVar67);
            auVar67 = vmulps_avx512vl(auVar67,auVar68._0_32_);
            auVar70 = vinsertf64x4_avx512f(in_ZMM17,auVar67,0);
            in_ZMM17 = auVar70;
          }
          if (iVar36 == 4) {
            auVar67 = vextractf64x4_avx512f(in_ZMM19,1);
            auVar63 = vaddps_avx512vl(auVar66,in_ZMM20._0_32_);
            auVar67 = vaddps_avx512vl(auVar63,auVar67);
            in_ZMM20 = ZEXT3264(auVar67);
            auVar56 = vextractf32x4_avx512vl(auVar67,1);
            auVar56 = vaddps_avx512vl(auVar67._0_16_,auVar56);
            auVar55 = vaddps_avx512vl(auVar56,auVar55);
            auVar56 = vmulps_avx512vl(auVar55,auVar68._0_16_);
            auVar70 = vinsertf32x4_avx512f(in_ZMM17,auVar56,0);
            in_ZMM17 = auVar70;
          }
          if (iVar36 == 1) {
            auVar123._32_32_ = auVar70._32_32_;
            auVar67 = vextractf64x4_avx512f(in_ZMM19,1);
            auVar123._0_32_ = vaddps_avx512vl(auVar66,auVar67);
            auVar125._16_48_ = auVar123._16_48_;
            auVar56 = vextractf32x4_avx512vl(auVar123._0_32_,1);
            auVar56 = vaddps_avx512vl(auVar123._0_16_,auVar56);
            auVar59 = vshufpd_avx512vl(auVar56,auVar56,1);
            auVar60 = vextractf32x4_avx512vl(in_ZMM20._0_32_,1);
            auVar60 = vaddps_avx512vl(auVar60,in_ZMM20._0_16_);
            auVar61 = vshufps_avx512vl(auVar60,auVar55,0x11);
            auVar55 = vshufps_avx512vl(auVar60,auVar55,0xbb);
            auVar55 = vaddps_avx512vl(auVar55,auVar61);
            in_ZMM20 = ZEXT1664(auVar55);
            auVar60 = vshufpd_avx512vl(auVar55,auVar55,1);
            auVar55 = vaddps_avx512vl(auVar55,auVar60);
            auVar55 = vhaddps_avx(auVar55,auVar55);
            auVar56 = vaddps_avx512vl(auVar59,auVar56);
            auVar59 = vmovshdup_avx512vl(auVar56);
            in_ZMM19 = ZEXT1664(auVar59);
            auVar58 = vaddss_avx512f(auVar59,auVar58);
            auVar125._0_16_ = in_ZMM17._0_16_;
            auVar124._4_60_ = auVar125._4_60_;
            auVar124._0_4_ = (auVar56._0_4_ + auVar58._0_4_ + auVar55._0_4_) * fVar135;
            auVar70 = vinsertf32x4_avx512f(in_ZMM17,auVar124._0_16_,0);
            in_ZMM17 = auVar70;
          }
          auVar55 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
          if (iVar36 < 8) {
            auVar127._16_48_ = auVar70._16_48_;
            auVar56 = in_ZMM17._0_16_;
            if (iVar36 == 1) {
              auVar58 = vaddss_avx512f(auVar56,auVar55);
              auVar55 = vrsqrtss_avx(auVar58,auVar58);
              auVar58 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar58._0_4_ * auVar55._0_4_)),auVar55,
                                            ZEXT416(0xc0400000));
              auVar55 = vmulss_avx512f(auVar55,ZEXT416(0xbf000000));
              fVar147 = auVar55._0_4_ * auVar58._0_4_;
              auVar127._0_16_ = auVar56;
              auVar126._4_60_ = auVar127._4_60_;
              auVar126._0_4_ = fVar147;
              in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar126._0_16_,0);
              auVar129._16_48_ = in_ZMM17._16_48_;
              auVar55 = vxorps_avx512vl(auVar57,auVar179);
              auVar129._0_16_ = auVar57;
              auVar128._4_60_ = auVar129._4_60_;
              auVar128._0_4_ = fVar147 * auVar55._0_4_;
              auVar70 = vinsertf32x4_avx512f(in_ZMM16,auVar128._0_16_,0);
              in_ZMM16 = auVar70;
            }
            else if (iVar36 == 4) {
              auVar55 = vbroadcastss_avx512vl(auVar55);
              auVar56 = vaddps_avx512vl(auVar56,auVar55);
              auVar55 = vrsqrtps_avx(auVar56);
              auVar166._0_4_ = auVar56._0_4_ * auVar55._0_4_;
              auVar166._4_4_ = auVar56._4_4_ * auVar55._4_4_;
              auVar166._8_4_ = auVar56._8_4_ * auVar55._8_4_;
              auVar166._12_4_ = auVar56._12_4_ * auVar55._12_4_;
              auVar56 = vfmadd213ps_avx512vl(auVar166,auVar55,auVar54);
              auVar167._0_4_ = auVar55._0_4_ * -0.5 * auVar56._0_4_;
              auVar167._4_4_ = auVar55._4_4_ * -0.5 * auVar56._4_4_;
              auVar167._8_4_ = auVar55._8_4_ * -0.5 * auVar56._8_4_;
              auVar167._12_4_ = auVar55._12_4_ * -0.5 * auVar56._12_4_;
              auVar55 = vxorps_avx512vl(auVar57,auVar179);
              auVar176._0_4_ = auVar167._0_4_ * auVar55._0_4_;
              auVar176._4_4_ = auVar167._4_4_ * auVar55._4_4_;
              auVar176._8_4_ = auVar167._8_4_ * auVar55._8_4_;
              auVar176._12_4_ = auVar167._12_4_ * auVar55._12_4_;
              in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar167,0);
              auVar70 = vinsertf32x4_avx512f(in_ZMM16,auVar176,0);
              in_ZMM16 = auVar70;
            }
          }
          else if (iVar36 == 8) {
            auVar66 = vbroadcastss_avx512vl(auVar55);
            auVar67 = vaddps_avx512vl(in_ZMM17._0_32_,auVar66);
            auVar66 = vrsqrtps_avx(auVar67);
            auVar34._4_4_ = auVar67._4_4_ * auVar66._4_4_;
            auVar34._0_4_ = auVar67._0_4_ * auVar66._0_4_;
            auVar34._8_4_ = auVar67._8_4_ * auVar66._8_4_;
            auVar34._12_4_ = auVar67._12_4_ * auVar66._12_4_;
            auVar34._16_4_ = auVar67._16_4_ * auVar66._16_4_;
            auVar34._20_4_ = auVar67._20_4_ * auVar66._20_4_;
            auVar34._24_4_ = auVar67._24_4_ * auVar66._24_4_;
            auVar34._28_4_ = auVar67._28_4_;
            auVar55 = vfmadd213ps_fma(auVar34,auVar66,auVar181);
            auVar172._0_4_ = auVar66._0_4_ * -0.5 * auVar55._0_4_;
            auVar172._4_4_ = auVar66._4_4_ * -0.5 * auVar55._4_4_;
            auVar172._8_4_ = auVar66._8_4_ * -0.5 * auVar55._8_4_;
            auVar172._12_4_ = auVar66._12_4_ * -0.5 * auVar55._12_4_;
            auVar172._16_4_ = auVar66._16_4_ * -0.5 * 0.0;
            auVar172._20_4_ = auVar66._20_4_ * -0.5 * 0.0;
            auVar172._24_4_ = auVar66._24_4_ * -0.5 * 0.0;
            auVar172._28_4_ = 0;
            auVar66 = vxorps_avx512vl(in_ZMM16._0_32_,auVar183);
            auVar35._4_4_ = auVar172._4_4_ * auVar66._4_4_;
            auVar35._0_4_ = auVar172._0_4_ * auVar66._0_4_;
            auVar35._8_4_ = auVar172._8_4_ * auVar66._8_4_;
            auVar35._12_4_ = auVar172._12_4_ * auVar66._12_4_;
            auVar35._16_4_ = auVar172._16_4_ * auVar66._16_4_;
            auVar35._20_4_ = auVar172._20_4_ * auVar66._20_4_;
            auVar35._24_4_ = auVar172._24_4_ * auVar66._24_4_;
            auVar35._28_4_ = auVar66._28_4_;
            in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar172,0);
            auVar70 = vinsertf64x4_avx512f(in_ZMM16,auVar35,0);
            in_ZMM16 = auVar70;
          }
          else if (iVar36 == 0x10) {
            auVar70 = vbroadcastss_avx512f(auVar55);
            auVar70 = vaddps_avx512f(in_ZMM17,auVar70);
            auVar185 = vrsqrt14ps_avx512f(auVar70);
            auVar70 = vmulps_avx512f(auVar70,auVar185);
            auVar70 = vfmadd213ps_avx512f(auVar70,auVar185,auVar71);
            auVar185 = vmulps_avx512f(auVar185,auVar72);
            in_ZMM17 = vmulps_avx512f(auVar185,auVar70);
            auVar70 = vxorps_avx512dq(in_ZMM16,auVar73);
            auVar70 = vmulps_avx512f(in_ZMM17,auVar70);
            in_ZMM16 = auVar70;
          }
          auVar56 = in_ZMM17._0_16_;
          auVar66 = in_ZMM17._0_32_;
          auVar55 = in_ZMM16._0_16_;
          auVar67 = in_ZMM16._0_32_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var5[-3]) == 0) {
            auVar58 = auVar56;
            if (iVar36 != 4) {
              auVar58 = vbroadcastss_avx512vl(auVar56);
            }
            in_ZMM18 = ZEXT1664(auVar58);
            auVar57 = auVar55;
            if (iVar36 != 4) {
              auVar57 = vbroadcastss_avx512vl(auVar55);
            }
            in_ZMM19 = ZEXT1664(auVar57);
            if (iVar36 != 8) {
              auVar66 = vinsertf32x4_avx512vl(ZEXT1632(auVar58),auVar58,1);
            }
            in_ZMM20 = ZEXT3264(auVar66);
            if (iVar36 != 8) {
              auVar67 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
            }
            auVar185 = in_ZMM16;
            auVar74 = in_ZMM17;
            if (iVar36 != 0x10) {
              auVar74 = vinsertf64x4_avx512f(in_ZMM20,auVar66,1);
              auVar185 = vinsertf64x4_avx512f(ZEXT3264(auVar67),auVar67,1);
            }
            auVar70 = auVar185;
            uVar51 = 0;
            if (0xf < (int)uVar47) {
              iVar38 = 0x10;
              do {
                auVar70 = vfmadd132ps_avx512f(*pauVar49,auVar185,auVar74);
                *pauVar49 = auVar70;
                pauVar49 = pauVar49 + 1;
                iVar38 = iVar38 + 0x10;
                uVar51 = uVar45;
              } while (iVar38 <= (int)uVar47);
            }
            uVar39 = uVar51 | 8;
            while ((int)uVar39 <= (int)uVar47) {
              auVar70._0_32_ = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar67,auVar66)
              ;
              *(undefined1 (*) [32])*pauVar49 = auVar70._0_32_;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              uVar39 = uVar51 + 0x10;
              uVar51 = uVar51 + 8;
            }
            iVar38 = uVar51 + 4;
            while (iVar38 <= (int)uVar47) {
              auVar70._0_16_ = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar57,auVar58)
              ;
              *(undefined1 (*) [16])*pauVar49 = auVar70._0_16_;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              iVar38 = uVar51 + 8;
              uVar51 = uVar51 + 4;
            }
            if ((int)uVar51 < (int)uVar47) {
              auVar185 = vpbroadcastq_avx512f();
              in_ZMM17 = vbroadcastss_avx512f(auVar56);
              in_ZMM16 = vbroadcastss_avx512f(auVar55);
              uVar42 = 0;
              do {
                auVar70 = vpbroadcastq_avx512f();
                auVar74 = vporq_avx512f(auVar70,auVar69);
                auVar70 = vporq_avx512f(auVar70,auVar184);
                uVar20 = vpcmpuq_avx512f(auVar70,auVar185,2);
                bVar30 = (byte)uVar20;
                uVar20 = vpcmpuq_avx512f(auVar74,auVar185,2);
                bVar31 = (byte)uVar20;
                uVar53 = CONCAT11(bVar31,bVar30);
                piVar1 = (int *)(*pauVar49 + uVar42 * 4);
                auVar132._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                auVar132._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                auVar132._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                auVar132._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                auVar132._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                auVar132._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                auVar132._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                auVar132._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                auVar132._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                auVar132._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                auVar132._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                auVar132._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                auVar132._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                auVar132._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                auVar132._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                auVar132._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                auVar75 = vfmadd213ps_avx512f(auVar132,in_ZMM17,in_ZMM16);
                auVar74 = *(undefined1 (*) [64])(*pauVar49 + uVar42 * 4);
                auVar70._0_4_ =
                     (uint)(bVar30 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar74._0_4_;
                bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                auVar70._4_4_ = (uint)bVar7 * auVar75._4_4_ | (uint)!bVar7 * auVar74._4_4_;
                bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
                auVar70._8_4_ = (uint)bVar7 * auVar75._8_4_ | (uint)!bVar7 * auVar74._8_4_;
                bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                auVar70._12_4_ = (uint)bVar7 * auVar75._12_4_ | (uint)!bVar7 * auVar74._12_4_;
                bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
                auVar70._16_4_ = (uint)bVar7 * auVar75._16_4_ | (uint)!bVar7 * auVar74._16_4_;
                bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
                auVar70._20_4_ = (uint)bVar7 * auVar75._20_4_ | (uint)!bVar7 * auVar74._20_4_;
                bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
                auVar70._24_4_ = (uint)bVar7 * auVar75._24_4_ | (uint)!bVar7 * auVar74._24_4_;
                bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
                auVar70._28_4_ = (uint)bVar7 * auVar75._28_4_ | (uint)!bVar7 * auVar74._28_4_;
                auVar70._32_4_ =
                     (uint)(bVar31 & 1) * auVar75._32_4_ |
                     (uint)!(bool)(bVar31 & 1) * auVar74._32_4_;
                bVar7 = (bool)(bVar31 >> 1 & 1);
                auVar70._36_4_ = (uint)bVar7 * auVar75._36_4_ | (uint)!bVar7 * auVar74._36_4_;
                bVar7 = (bool)(bVar31 >> 2 & 1);
                auVar70._40_4_ = (uint)bVar7 * auVar75._40_4_ | (uint)!bVar7 * auVar74._40_4_;
                bVar7 = (bool)(bVar31 >> 3 & 1);
                auVar70._44_4_ = (uint)bVar7 * auVar75._44_4_ | (uint)!bVar7 * auVar74._44_4_;
                bVar7 = (bool)(bVar31 >> 4 & 1);
                auVar70._48_4_ = (uint)bVar7 * auVar75._48_4_ | (uint)!bVar7 * auVar74._48_4_;
                bVar7 = (bool)(bVar31 >> 5 & 1);
                auVar70._52_4_ = (uint)bVar7 * auVar75._52_4_ | (uint)!bVar7 * auVar74._52_4_;
                bVar7 = (bool)(bVar31 >> 6 & 1);
                auVar70._56_4_ = (uint)bVar7 * auVar75._56_4_ | (uint)!bVar7 * auVar74._56_4_;
                auVar70._60_4_ =
                     (uint)(bVar31 >> 7) * auVar75._60_4_ |
                     (uint)!(bool)(bVar31 >> 7) * auVar74._60_4_;
                *(undefined1 (*) [64])(*pauVar49 + uVar42 * 4) = auVar70;
                uVar42 = uVar42 + 0x10;
              } while (((ulong)(~uVar51 + uVar47) + 0x10 & 0x1fffffff0) != uVar42);
            }
          }
          else {
            pauVar37 = pauVar50;
            pauVar41 = pauVar43;
            if (0xf < (int)uVar47 && iVar36 == 0x10) {
              iVar38 = 0x10;
              do {
                auVar70 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar41));
                auVar185 = vfmadd132ps_avx512f(*pauVar49,in_ZMM16,in_ZMM17);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar28._4_4_ = uVar3;
                auVar28._0_4_ = uVar3;
                auVar28._8_4_ = uVar3;
                auVar28._12_4_ = uVar3;
                auVar28._16_4_ = uVar3;
                auVar28._20_4_ = uVar3;
                auVar28._24_4_ = uVar3;
                auVar28._28_4_ = uVar3;
                auVar28._32_4_ = uVar3;
                auVar28._36_4_ = uVar3;
                auVar28._40_4_ = uVar3;
                auVar28._44_4_ = uVar3;
                auVar28._48_4_ = uVar3;
                auVar28._52_4_ = uVar3;
                auVar28._56_4_ = uVar3;
                auVar28._60_4_ = uVar3;
                auVar70 = vfmadd213ps_avx512f(auVar185,auVar70,auVar28);
                *pauVar49 = auVar70;
                pauVar49 = pauVar49 + 1;
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                iVar38 = iVar38 + 0x10;
              } while (iVar38 <= (int)uVar47);
            }
            if (iVar36 == 8) {
              uVar51 = 8;
              if (0xf < (int)uVar47) {
                auVar185 = vinsertf64x4_avx512f(in_ZMM17,auVar66,1);
                in_ZMM18 = vinsertf64x4_avx512f(in_ZMM16,auVar67,1);
                iVar38 = 0x10;
                do {
                  in_ZMM20 = ZEXT464(*(uint *)(*pauVar37 + 4));
                  auVar70 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar41),auVar136,
                                              ZEXT464(*(uint *)(*pauVar41 + 4)));
                  in_ZMM19 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar136,in_ZMM20);
                  auVar74 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar185);
                  auVar70 = vfmadd213ps_avx512f(auVar74,auVar70,in_ZMM19);
                  *pauVar49 = auVar70;
                  pauVar49 = pauVar49 + 1;
                  pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                  iVar38 = iVar38 + 0x10;
                  uVar51 = uVar47 | 8;
                } while (iVar38 <= (int)uVar47);
              }
              for (; (int)uVar51 <= (int)uVar47; uVar51 = uVar51 + 8) {
                uVar3 = *(undefined4 *)*pauVar41;
                auVar173._4_4_ = uVar3;
                auVar173._0_4_ = uVar3;
                auVar173._8_4_ = uVar3;
                auVar173._12_4_ = uVar3;
                auVar173._16_4_ = uVar3;
                auVar173._20_4_ = uVar3;
                auVar173._24_4_ = uVar3;
                auVar173._28_4_ = uVar3;
                auVar63 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar67,auVar66);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar26._4_4_ = uVar3;
                auVar26._0_4_ = uVar3;
                auVar26._8_4_ = uVar3;
                auVar26._12_4_ = uVar3;
                auVar26._16_4_ = uVar3;
                auVar26._20_4_ = uVar3;
                auVar26._24_4_ = uVar3;
                auVar26._28_4_ = uVar3;
                auVar70._0_32_ = vfmadd213ps_avx512vl(auVar63,auVar173,auVar26);
                *(undefined1 (*) [32])*pauVar49 = auVar70._0_32_;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            if (iVar36 == 4) {
              uVar51 = 0;
              if (0xf < (int)uVar47) {
                auVar70 = vinsertf64x4_avx512f(in_ZMM17,auVar66,1);
                auVar185 = vpermpd_avx512f(auVar70,0x44);
                auVar70 = vinsertf64x4_avx512f(in_ZMM16,auVar67,1);
                in_ZMM18 = vpermpd_avx512f(auVar70,0x44);
                iVar38 = 0x10;
                do {
                  auVar70 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 8)));
                  auVar74 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 0xc)));
                  auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar41),
                                             ZEXT416(*(uint *)(*pauVar41 + 4)),0);
                  auVar63 = vpermpd_avx512vl(ZEXT1632(auVar58),0x50);
                  auVar70 = vinsertf64x4_avx512f(auVar70,auVar63,0);
                  auVar75 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                  in_ZMM20 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                  auVar130._0_48_ = auVar70._0_48_;
                  auVar130._48_8_ = auVar74._48_8_;
                  auVar130._56_8_ = auVar74._56_8_;
                  auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                             ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                  auVar63 = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                  auVar70 = vinsertf64x4_avx512f(auVar75,auVar63,0);
                  auVar131._0_48_ = auVar70._0_48_;
                  auVar131._48_8_ = in_ZMM20._48_8_;
                  auVar131._56_8_ = in_ZMM20._56_8_;
                  auVar70 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar185);
                  auVar70 = vfmadd213ps_avx512f(auVar70,auVar130,auVar131);
                  *pauVar49 = auVar70;
                  pauVar49 = pauVar49 + 1;
                  pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = iVar38 + 0x10;
                  in_ZMM19 = auVar70;
                  uVar51 = uVar45;
                } while (iVar38 <= (int)uVar47);
              }
              if ((int)(uVar51 | 8) <= (int)uVar47) {
                auVar133._32_32_ = auVar70._32_32_;
                auVar66 = vpermpd_avx512vl(auVar66,0x44);
                auVar133._0_32_ = vpermpd_avx512vl(auVar67,0x44);
                in_ZMM18 = ZEXT3264(auVar133._0_32_);
                auVar70 = auVar133;
                uVar39 = uVar51;
                do {
                  auVar58 = vshufps_avx(ZEXT416(*(uint *)*pauVar41),
                                        ZEXT416(*(uint *)(*pauVar41 + 4)),0);
                  auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                             ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                  auVar67 = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                  auVar63 = vpermpd_avx2(ZEXT1632(auVar57),0x50);
                  auVar62 = vfmadd132ps_avx512vl
                                      (*(undefined1 (*) [32])*pauVar49,auVar133._0_32_,auVar66);
                  auVar70._0_32_ = vfmadd213ps_avx512vl(auVar62,auVar67,auVar63);
                  in_ZMM19 = ZEXT3264(auVar70._0_32_);
                  *(undefined1 (*) [32])*pauVar49 = auVar70._0_32_;
                  pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                  pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                  uVar51 = uVar39 + 8;
                  iVar38 = uVar39 + 0x10;
                  uVar39 = uVar51;
                } while (iVar38 <= (int)uVar47);
              }
              while (uVar51 = uVar51 + 4, (int)uVar51 <= (int)uVar47) {
                uVar3 = *(undefined4 *)*pauVar41;
                auVar168._4_4_ = uVar3;
                auVar168._0_4_ = uVar3;
                auVar168._8_4_ = uVar3;
                auVar168._12_4_ = uVar3;
                auVar58 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar55,auVar56);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar22._4_4_ = uVar3;
                auVar22._0_4_ = uVar3;
                auVar22._8_4_ = uVar3;
                auVar22._12_4_ = uVar3;
                auVar70._0_16_ = vfmadd213ps_avx512vl(auVar58,auVar168,auVar22);
                *(undefined1 (*) [16])*pauVar49 = auVar70._0_16_;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            if (iVar36 == 1) {
              in_ZMM18 = vbroadcastss_avx512f(auVar56);
              in_ZMM19 = vbroadcastss_avx512f(auVar55);
              auVar70 = in_ZMM19;
              uVar51 = 0;
              if (0xf < (int)uVar47) {
                iVar38 = 0x10;
                do {
                  auVar70 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,in_ZMM18);
                  auVar70 = vfmadd213ps_avx512f(auVar70,*pauVar41,*pauVar37);
                  *pauVar49 = auVar70;
                  pauVar49 = pauVar49 + 1;
                  pauVar41 = pauVar41 + 1;
                  pauVar37 = pauVar37 + 1;
                  iVar38 = iVar38 + 0x10;
                  uVar51 = uVar45;
                } while (iVar38 <= (int)uVar47);
              }
              uVar39 = uVar51 | 8;
              while ((int)uVar39 <= (int)uVar47) {
                auVar70._0_32_ =
                     vfmadd132ps_avx512vl
                               (*(undefined1 (*) [32])*pauVar49,in_ZMM19._0_32_,in_ZMM18._0_32_);
                auVar58 = vfmadd213ps_fma(auVar70._0_32_,*(undefined1 (*) [32])*pauVar41,
                                          *(undefined1 (*) [32])*pauVar37);
                *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar58);
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x20);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                uVar39 = uVar51 + 0x10;
                uVar51 = uVar51 + 8;
              }
              iVar38 = uVar51 + 4;
              while (iVar38 <= (int)uVar47) {
                auVar70._0_16_ =
                     vfmadd132ps_avx512vl
                               (*(undefined1 (*) [16])*pauVar49,in_ZMM19._0_16_,in_ZMM18._0_16_);
                auVar58 = vfmadd213ps_fma(auVar70._0_16_,*(undefined1 (*) [16])*pauVar41,
                                          *(undefined1 (*) [16])*pauVar37);
                *(undefined1 (*) [16])*pauVar49 = auVar58;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                iVar38 = uVar51 + 8;
                uVar51 = uVar51 + 4;
              }
              if (uVar47 - uVar51 != 0 && (int)uVar51 <= (int)uVar47) {
                lVar52 = 0;
                do {
                  auVar70._0_16_ =
                       vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar52 * 4)),auVar55,
                                           auVar56);
                  auVar58 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar41 + lVar52 * 4)),
                                            auVar70._0_16_,
                                            ZEXT416(*(uint *)(*pauVar37 + lVar52 * 4)));
                  *(int *)(*pauVar49 + lVar52 * 4) = auVar58._0_4_;
                  lVar52 = lVar52 + 1;
                } while (uVar47 - uVar51 != (int)lVar52);
              }
            }
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 != uVar44);
      }
    }
    else if ((iVar38 == 2) && (0 < (int)uVar45)) {
      uVar44 = iVar4 * iVar36;
      fVar135 = 1.0 / (float)iVar4;
      auVar68 = vbroadcastss_avx512f(ZEXT416((uint)fVar135));
      uVar47 = uVar44 & 0xfffffff0;
      uVar48 = 0;
      auVar69 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar70 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar177._8_4_ = 0x80000000;
      auVar177._0_8_ = 0x8000000080000000;
      auVar177._12_4_ = 0x80000000;
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0xc0400000));
      auVar66._8_4_ = 0xc0400000;
      auVar66._0_8_ = 0xc0400000c0400000;
      auVar66._12_4_ = 0xc0400000;
      auVar66._16_4_ = 0xc0400000;
      auVar66._20_4_ = 0xc0400000;
      auVar66._24_4_ = 0xc0400000;
      auVar66._28_4_ = 0xc0400000;
      auVar67._8_4_ = 0x80000000;
      auVar67._0_8_ = 0x8000000080000000;
      auVar67._12_4_ = 0x80000000;
      auVar67._16_4_ = 0x80000000;
      auVar67._20_4_ = 0x80000000;
      auVar67._24_4_ = 0x80000000;
      auVar67._28_4_ = 0x80000000;
      auVar71 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
      auVar72 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      auVar73 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar184 = auVar73;
      do {
        auVar58 = in_ZMM20._0_16_;
        auVar56 = in_ZMM16._0_16_;
        pauVar49 = (undefined1 (*) [64])
                   ((long)bottom_top_blob->w * uVar48 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar134 = auVar184._16_48_;
        auVar55 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        auVar184 = ZEXT1664(auVar55);
        pauVar37 = pauVar49;
        uVar51 = 0;
        if (0xf < (int)uVar44) {
          iVar38 = 0x10;
          do {
            auVar184 = vaddps_avx512f(auVar184,*pauVar37);
            auVar134 = auVar184._16_48_;
            pauVar37 = pauVar37 + 1;
            iVar38 = iVar38 + 0x10;
            uVar51 = uVar47;
          } while (iVar38 <= (int)uVar44);
        }
        uVar39 = uVar51 | 8;
        auVar74._0_16_ = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        auVar74._16_48_ = auVar134;
        auVar185 = ZEXT1664(auVar74._0_16_);
        auVar63 = ZEXT1632(auVar74._0_16_);
        auVar62 = auVar134._16_32_;
        while ((int)uVar39 <= (int)uVar44) {
          auVar74._0_32_ = vaddps_avx512vl(auVar185._0_32_,*(undefined1 (*) [32])*pauVar37);
          auVar185 = ZEXT3264(auVar74._0_32_);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
          uVar39 = uVar51 + 0x10;
          uVar51 = uVar51 + 8;
          auVar63 = auVar74._0_32_;
          auVar62 = auVar74._32_32_;
        }
        iVar38 = uVar51 + 4;
        auVar55 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        while (iVar38 <= (int)uVar44) {
          auVar55 = vaddps_avx512vl(auVar55,*(undefined1 (*) [16])*pauVar37);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
          iVar38 = uVar51 + 8;
          uVar51 = uVar51 + 4;
        }
        auVar57 = ZEXT816(0) << 0x40;
        if ((int)uVar51 < (int)uVar44) {
          auVar74 = vpbroadcastq_avx512f();
          auVar56 = vxorps_avx512vl(auVar58,auVar58);
          uVar42 = 0;
          auVar185 = ZEXT1664(auVar56);
          do {
            auVar76 = auVar185;
            auVar185 = vpbroadcastq_avx512f();
            auVar75 = vporq_avx512f(auVar185,auVar69);
            auVar185 = vporq_avx512f(auVar185,auVar70);
            uVar20 = vpcmpuq_avx512f(auVar185,auVar74,2);
            bVar30 = (byte)uVar20;
            uVar20 = vpcmpuq_avx512f(auVar75,auVar74,2);
            bVar31 = (byte)uVar20;
            uVar53 = CONCAT11(bVar31,bVar30);
            piVar1 = (int *)(*pauVar37 + uVar42 * 4);
            auVar185._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
            auVar185._0_4_ = (uint)(bVar30 & 1) * *piVar1;
            auVar185._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
            auVar185._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
            auVar185._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
            auVar185._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
            auVar185._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
            auVar185._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
            auVar185._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
            auVar185._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
            auVar185._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
            auVar185._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
            auVar185._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
            auVar185._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
            auVar185._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
            auVar185._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
            auVar185 = vaddps_avx512f(auVar185,auVar76);
            auVar58 = auVar185._0_16_;
            uVar42 = uVar42 + 0x10;
          } while (((ulong)(~uVar51 + uVar44) + 0x10 & 0x1fffffff0) != uVar42);
          auVar75._0_4_ =
               (uint)(bVar30 & 1) * auVar185._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar76._0_4_;
          bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
          auVar75._4_4_ = (uint)bVar7 * auVar185._4_4_ | (uint)!bVar7 * auVar76._4_4_;
          bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
          auVar75._8_4_ = (uint)bVar7 * auVar185._8_4_ | (uint)!bVar7 * auVar76._8_4_;
          bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
          auVar75._12_4_ = (uint)bVar7 * auVar185._12_4_ | (uint)!bVar7 * auVar76._12_4_;
          bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
          auVar75._16_4_ = (uint)bVar7 * auVar185._16_4_ | (uint)!bVar7 * auVar76._16_4_;
          bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
          auVar75._20_4_ = (uint)bVar7 * auVar185._20_4_ | (uint)!bVar7 * auVar76._20_4_;
          bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
          auVar75._24_4_ = (uint)bVar7 * auVar185._24_4_ | (uint)!bVar7 * auVar76._24_4_;
          bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
          auVar75._28_4_ = (uint)bVar7 * auVar185._28_4_ | (uint)!bVar7 * auVar76._28_4_;
          auVar75._32_4_ =
               (uint)(bVar31 & 1) * auVar185._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar76._32_4_;
          bVar7 = (bool)(bVar31 >> 1 & 1);
          auVar75._36_4_ = (uint)bVar7 * auVar185._36_4_ | (uint)!bVar7 * auVar76._36_4_;
          bVar7 = (bool)(bVar31 >> 2 & 1);
          auVar75._40_4_ = (uint)bVar7 * auVar185._40_4_ | (uint)!bVar7 * auVar76._40_4_;
          bVar7 = (bool)(bVar31 >> 3 & 1);
          auVar75._44_4_ = (uint)bVar7 * auVar185._44_4_ | (uint)!bVar7 * auVar76._44_4_;
          bVar7 = (bool)(bVar31 >> 4 & 1);
          auVar75._48_4_ = (uint)bVar7 * auVar185._48_4_ | (uint)!bVar7 * auVar76._48_4_;
          bVar7 = (bool)(bVar31 >> 5 & 1);
          auVar75._52_4_ = (uint)bVar7 * auVar185._52_4_ | (uint)!bVar7 * auVar76._52_4_;
          bVar7 = (bool)(bVar31 >> 6 & 1);
          auVar75._56_4_ = (uint)bVar7 * auVar185._56_4_ | (uint)!bVar7 * auVar76._56_4_;
          auVar75._60_4_ =
               (uint)(bVar31 >> 7) * auVar185._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar76._60_4_;
          auVar62 = vextractf64x4_avx512f(auVar75,1);
          auVar185 = vaddps_avx512f(auVar75,ZEXT3264(auVar62));
          auVar62 = auVar185._32_32_;
          auVar56 = vextractf32x4_avx512vl(auVar185._0_32_,1);
          auVar57 = vaddps_avx512vl(auVar185._0_16_,auVar56);
          auVar56 = vshufpd_avx512vl(auVar57,auVar57,1);
          auVar57 = vaddps_avx512vl(auVar57,auVar56);
          auVar57 = vhaddps_avx(auVar57,auVar57);
        }
        auVar65 = auVar184._0_32_;
        if (iVar36 == 8) {
          auVar64 = vextractf64x4_avx512f(auVar184,1);
          auVar63 = vaddps_avx512vl(auVar65,auVar63);
          auVar63 = vaddps_avx512vl(auVar63,auVar64);
          auVar64 = vmulps_avx512vl(auVar63,auVar68._0_32_);
          in_ZMM16 = ZEXT3264(auVar64);
        }
        else {
          auVar56 = vxorps_avx512vl(auVar56,auVar56);
          in_ZMM16 = ZEXT1664(auVar56);
          if (iVar36 == 0x10) {
            in_ZMM16 = vmulps_avx512f(auVar184,auVar68);
            auVar62 = in_ZMM16._32_32_;
          }
        }
        if (iVar36 == 4) {
          auVar62 = vextractf64x4_avx512f(auVar184,1);
          auVar63 = vaddps_avx512vl(auVar65,auVar63);
          auVar63 = vaddps_avx512vl(auVar63,auVar62);
          auVar56 = vextractf32x4_avx512vl(auVar63,1);
          auVar56 = vaddps_avx512vl(auVar63._0_16_,auVar56);
          auVar55 = vaddps_avx512vl(auVar56,auVar55);
          auVar58 = vmulps_avx512vl(auVar55,auVar68._0_16_);
          in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar58,0);
          auVar62 = in_ZMM16._32_32_;
        }
        if (iVar36 == 1) {
          auVar64 = vextractf64x4_avx512f(auVar184,1);
          auVar76._0_32_ = vaddps_avx512vl(auVar65,auVar64);
          auVar76._32_32_ = auVar62;
          auVar78._16_48_ = auVar76._16_48_;
          auVar56 = vextractf32x4_avx512vl(auVar76._0_32_,1);
          auVar59 = vaddps_avx512vl(auVar76._0_16_,auVar56);
          auVar58 = vshufpd_avx512vl(auVar59,auVar59,1);
          auVar56 = vextractf32x4_avx512vl(auVar63,1);
          auVar56 = vaddps_avx512vl(auVar56,auVar63._0_16_);
          auVar60 = vshufps_avx512vl(auVar56,auVar55,0x11);
          auVar55 = vshufps_avx512vl(auVar56,auVar55,0xbb);
          auVar56 = vaddps_avx512vl(auVar55,auVar60);
          auVar55 = vshufpd_avx512vl(auVar56,auVar56,1);
          auVar56 = vaddps_avx512vl(auVar56,auVar55);
          auVar56 = vhaddps_avx(auVar56,auVar56);
          auVar59 = vaddps_avx512vl(auVar58,auVar59);
          auVar60 = vmovshdup_avx512vl(auVar59);
          auVar57 = vaddss_avx512f(auVar60,auVar57);
          auVar57 = vaddss_avx512f(auVar59,auVar57);
          auVar78._0_16_ = in_ZMM16._0_16_;
          auVar77._4_60_ = auVar78._4_60_;
          auVar77._0_4_ = (auVar57._0_4_ + auVar56._0_4_) * fVar135;
          in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar77._0_16_,0);
        }
        in_ZMM18 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
        auVar57 = in_ZMM16._0_16_;
        auVar56 = auVar57;
        if (iVar36 != 4) {
          auVar56 = vbroadcastss_avx512vl(auVar57);
        }
        auVar63 = in_ZMM16._0_32_;
        if (iVar36 != 8) {
          auVar63 = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar56,1);
        }
        auVar184 = in_ZMM16;
        if (iVar36 != 0x10) {
          auVar184 = vinsertf64x4_avx512f(ZEXT3264(auVar63),auVar63,1);
        }
        auVar134 = auVar184._16_48_;
        pauVar37 = pauVar49;
        if ((int)uVar44 < 0x10) {
          auVar55 = vxorps_avx512vl(auVar55,auVar55);
          in_ZMM19 = ZEXT1664(auVar55);
          uVar51 = 0;
        }
        else {
          auVar55 = vxorps_avx512vl(auVar55,auVar55);
          in_ZMM19 = ZEXT1664(auVar55);
          iVar38 = 0x10;
          do {
            auVar185 = vsubps_avx512f(*pauVar37,auVar184);
            in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar185,auVar185);
            auVar134 = in_ZMM19._16_48_;
            pauVar37 = pauVar37 + 1;
            iVar38 = iVar38 + 0x10;
            uVar51 = uVar47;
          } while (iVar38 <= (int)uVar44);
        }
        uVar39 = uVar51 | 8;
        auVar79._0_16_ = vxorps_avx512vl(auVar58,auVar58);
        auVar79._16_48_ = auVar134;
        in_ZMM20 = ZEXT1664(auVar79._0_16_);
        while ((int)uVar39 <= (int)uVar44) {
          auVar62 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar63);
          auVar79._0_32_ = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar62,auVar62);
          auVar134 = auVar79._16_48_;
          in_ZMM20 = ZEXT3264(auVar79._0_32_);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
          uVar39 = uVar51 + 0x10;
          uVar51 = uVar51 + 8;
        }
        iVar38 = uVar51 + 4;
        auVar55 = vxorps_avx512vl(auVar63._0_16_,auVar63._0_16_);
        while (iVar38 <= (int)uVar44) {
          auVar58 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,auVar56);
          auVar55 = vfmadd231ps_avx512vl(auVar55,auVar58,auVar58);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
          iVar38 = uVar51 + 8;
          uVar51 = uVar51 + 4;
        }
        auVar58 = ZEXT816(0) << 0x40;
        if ((int)uVar51 < (int)uVar44) {
          auVar184 = vpbroadcastq_avx512f();
          auVar185 = vbroadcastss_avx512f(auVar57);
          auVar56 = auVar185._0_16_;
          auVar58 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          uVar42 = 0;
          in_ZMM24 = ZEXT1664(auVar58);
          do {
            auVar76 = in_ZMM24;
            auVar74 = vpbroadcastq_avx512f();
            auVar75 = vporq_avx512f(auVar74,auVar69);
            auVar74 = vporq_avx512f(auVar74,auVar70);
            uVar20 = vpcmpuq_avx512f(auVar74,auVar184,2);
            bVar30 = (byte)uVar20;
            uVar20 = vpcmpuq_avx512f(auVar75,auVar184,2);
            bVar31 = (byte)uVar20;
            uVar53 = CONCAT11(bVar31,bVar30);
            piVar1 = (int *)(*pauVar37 + uVar42 * 4);
            auVar80._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
            auVar80._0_4_ = (uint)(bVar30 & 1) * *piVar1;
            auVar80._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
            auVar80._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
            auVar80._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
            auVar80._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
            auVar80._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
            auVar80._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
            auVar80._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
            auVar80._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
            auVar80._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
            auVar80._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
            auVar80._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
            auVar80._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
            auVar80._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
            auVar80._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
            auVar74 = vsubps_avx512f(auVar80,auVar185);
            in_ZMM24 = vfmadd213ps_avx512f(auVar74,auVar74,auVar76);
            uVar42 = uVar42 + 0x10;
          } while (((ulong)(~uVar51 + uVar44) + 0x10 & 0x1fffffff0) != uVar42);
          auVar81._0_4_ =
               (uint)(bVar30 & 1) * in_ZMM24._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar76._0_4_;
          bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
          auVar81._4_4_ = (uint)bVar7 * in_ZMM24._4_4_ | (uint)!bVar7 * auVar76._4_4_;
          bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
          auVar81._8_4_ = (uint)bVar7 * in_ZMM24._8_4_ | (uint)!bVar7 * auVar76._8_4_;
          bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
          auVar81._12_4_ = (uint)bVar7 * in_ZMM24._12_4_ | (uint)!bVar7 * auVar76._12_4_;
          bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
          auVar81._16_4_ = (uint)bVar7 * in_ZMM24._16_4_ | (uint)!bVar7 * auVar76._16_4_;
          bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
          auVar81._20_4_ = (uint)bVar7 * in_ZMM24._20_4_ | (uint)!bVar7 * auVar76._20_4_;
          bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
          auVar81._24_4_ = (uint)bVar7 * in_ZMM24._24_4_ | (uint)!bVar7 * auVar76._24_4_;
          bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
          auVar81._28_4_ = (uint)bVar7 * in_ZMM24._28_4_ | (uint)!bVar7 * auVar76._28_4_;
          auVar81._32_4_ =
               (uint)(bVar31 & 1) * in_ZMM24._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar76._32_4_;
          bVar7 = (bool)(bVar31 >> 1 & 1);
          auVar81._36_4_ = (uint)bVar7 * in_ZMM24._36_4_ | (uint)!bVar7 * auVar76._36_4_;
          bVar7 = (bool)(bVar31 >> 2 & 1);
          auVar81._40_4_ = (uint)bVar7 * in_ZMM24._40_4_ | (uint)!bVar7 * auVar76._40_4_;
          bVar7 = (bool)(bVar31 >> 3 & 1);
          auVar81._44_4_ = (uint)bVar7 * in_ZMM24._44_4_ | (uint)!bVar7 * auVar76._44_4_;
          bVar7 = (bool)(bVar31 >> 4 & 1);
          auVar81._48_4_ = (uint)bVar7 * in_ZMM24._48_4_ | (uint)!bVar7 * auVar76._48_4_;
          bVar7 = (bool)(bVar31 >> 5 & 1);
          auVar81._52_4_ = (uint)bVar7 * in_ZMM24._52_4_ | (uint)!bVar7 * auVar76._52_4_;
          bVar7 = (bool)(bVar31 >> 6 & 1);
          auVar81._56_4_ = (uint)bVar7 * in_ZMM24._56_4_ | (uint)!bVar7 * auVar76._56_4_;
          auVar81._60_4_ =
               (uint)(bVar31 >> 7) * in_ZMM24._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar76._60_4_;
          auVar63 = vextractf64x4_avx512f(auVar81,1);
          auVar184 = vaddps_avx512f(auVar81,ZEXT3264(auVar63));
          auVar134 = auVar184._16_48_;
          auVar154._0_4_ = auVar184._0_4_ + auVar184._16_4_;
          auVar154._4_4_ = auVar184._4_4_ + auVar184._20_4_;
          auVar154._8_4_ = auVar184._8_4_ + auVar184._24_4_;
          auVar154._12_4_ = auVar184._12_4_ + auVar184._28_4_;
          auVar58 = vshufpd_avx(auVar154,auVar154,1);
          auVar155._0_4_ = auVar154._0_4_ + auVar58._0_4_;
          auVar155._4_4_ = auVar154._4_4_ + auVar58._4_4_;
          auVar155._8_4_ = auVar154._8_4_ + auVar58._8_4_;
          auVar155._12_4_ = auVar154._12_4_ + auVar58._12_4_;
          auVar58 = vhaddps_avx(auVar155,auVar155);
        }
        auVar184._0_16_ = vxorps_avx512vl(auVar56,auVar56);
        auVar184._16_48_ = auVar134;
        in_ZMM17 = ZEXT1664(auVar184._0_16_);
        if (iVar36 == 0x10) {
          auVar184 = vmulps_avx512f(in_ZMM19,auVar68);
          in_ZMM17 = auVar184;
        }
        auVar63 = in_ZMM19._0_32_;
        if (iVar36 == 8) {
          auVar62 = vextractf64x4_avx512f(in_ZMM19,1);
          auVar65 = vaddps_avx512vl(auVar63,in_ZMM20._0_32_);
          auVar62 = vaddps_avx512vl(auVar65,auVar62);
          in_ZMM20 = ZEXT3264(auVar62);
          auVar62 = vmulps_avx512vl(auVar62,auVar68._0_32_);
          auVar184 = vinsertf64x4_avx512f(in_ZMM17,auVar62,0);
          in_ZMM17 = auVar184;
        }
        if (iVar36 == 4) {
          auVar62 = vextractf64x4_avx512f(in_ZMM19,1);
          auVar65 = vaddps_avx512vl(auVar63,in_ZMM20._0_32_);
          auVar62 = vaddps_avx512vl(auVar65,auVar62);
          in_ZMM20 = ZEXT3264(auVar62);
          auVar56 = vextractf32x4_avx512vl(auVar62,1);
          auVar56 = vaddps_avx512vl(auVar62._0_16_,auVar56);
          auVar55 = vaddps_avx512vl(auVar56,auVar55);
          auVar56 = vmulps_avx512vl(auVar55,auVar68._0_16_);
          auVar184 = vinsertf32x4_avx512f(in_ZMM17,auVar56,0);
          in_ZMM17 = auVar184;
        }
        if (iVar36 == 1) {
          auVar82._32_32_ = auVar184._32_32_;
          auVar62 = vextractf64x4_avx512f(in_ZMM19,1);
          auVar82._0_32_ = vaddps_avx512vl(auVar63,auVar62);
          auVar84._16_48_ = auVar82._16_48_;
          auVar56 = vextractf32x4_avx512vl(auVar82._0_32_,1);
          auVar56 = vaddps_avx512vl(auVar82._0_16_,auVar56);
          auVar59 = vshufpd_avx512vl(auVar56,auVar56,1);
          auVar60 = vextractf32x4_avx512vl(in_ZMM20._0_32_,1);
          auVar60 = vaddps_avx512vl(auVar60,in_ZMM20._0_16_);
          auVar61 = vshufps_avx512vl(auVar60,auVar55,0x11);
          auVar55 = vshufps_avx512vl(auVar60,auVar55,0xbb);
          auVar55 = vaddps_avx512vl(auVar55,auVar61);
          in_ZMM20 = ZEXT1664(auVar55);
          auVar60 = vshufpd_avx512vl(auVar55,auVar55,1);
          auVar55 = vaddps_avx512vl(auVar55,auVar60);
          auVar55 = vhaddps_avx(auVar55,auVar55);
          auVar56 = vaddps_avx512vl(auVar59,auVar56);
          auVar59 = vmovshdup_avx512vl(auVar56);
          in_ZMM19 = ZEXT1664(auVar59);
          auVar58 = vaddss_avx512f(auVar59,auVar58);
          auVar84._0_16_ = in_ZMM17._0_16_;
          auVar83._4_60_ = auVar84._4_60_;
          auVar83._0_4_ = (auVar56._0_4_ + auVar58._0_4_ + auVar55._0_4_) * fVar135;
          auVar184 = vinsertf32x4_avx512f(in_ZMM17,auVar83._0_16_,0);
          in_ZMM17 = auVar184;
        }
        auVar55 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var5[-3]));
        if (iVar36 < 8) {
          auVar86._16_48_ = auVar184._16_48_;
          auVar56 = in_ZMM17._0_16_;
          if (iVar36 == 1) {
            auVar58 = vaddss_avx512f(auVar56,auVar55);
            auVar55 = vrsqrtss_avx(auVar58,auVar58);
            auVar58 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar58._0_4_ * auVar55._0_4_)),auVar55,
                                          ZEXT416(0xc0400000));
            auVar55 = vmulss_avx512f(auVar55,ZEXT416(0xbf000000));
            fVar147 = auVar55._0_4_ * auVar58._0_4_;
            auVar86._0_16_ = auVar56;
            auVar85._4_60_ = auVar86._4_60_;
            auVar85._0_4_ = fVar147;
            in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar85._0_16_,0);
            auVar88._16_48_ = in_ZMM17._16_48_;
            auVar55 = vxorps_avx512vl(auVar57,auVar177);
            auVar88._0_16_ = auVar57;
            auVar87._4_60_ = auVar88._4_60_;
            auVar87._0_4_ = fVar147 * auVar55._0_4_;
            auVar184 = vinsertf32x4_avx512f(in_ZMM16,auVar87._0_16_,0);
            in_ZMM16 = auVar184;
          }
          else if (iVar36 == 4) {
            auVar55 = vbroadcastss_avx512vl(auVar55);
            auVar56 = vaddps_avx512vl(auVar56,auVar55);
            auVar55 = vrsqrtps_avx(auVar56);
            auVar156._0_4_ = auVar56._0_4_ * auVar55._0_4_;
            auVar156._4_4_ = auVar56._4_4_ * auVar55._4_4_;
            auVar156._8_4_ = auVar56._8_4_ * auVar55._8_4_;
            auVar156._12_4_ = auVar56._12_4_ * auVar55._12_4_;
            auVar56 = vfmadd213ps_avx512vl(auVar156,auVar55,auVar54);
            auVar157._0_4_ = auVar55._0_4_ * -0.5 * auVar56._0_4_;
            auVar157._4_4_ = auVar55._4_4_ * -0.5 * auVar56._4_4_;
            auVar157._8_4_ = auVar55._8_4_ * -0.5 * auVar56._8_4_;
            auVar157._12_4_ = auVar55._12_4_ * -0.5 * auVar56._12_4_;
            auVar55 = vxorps_avx512vl(auVar57,auVar177);
            auVar174._0_4_ = auVar157._0_4_ * auVar55._0_4_;
            auVar174._4_4_ = auVar157._4_4_ * auVar55._4_4_;
            auVar174._8_4_ = auVar157._8_4_ * auVar55._8_4_;
            auVar174._12_4_ = auVar157._12_4_ * auVar55._12_4_;
            in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar157,0);
            auVar184 = vinsertf32x4_avx512f(in_ZMM16,auVar174,0);
            in_ZMM16 = auVar184;
          }
        }
        else if (iVar36 == 8) {
          auVar63 = vbroadcastss_avx512vl(auVar55);
          auVar65 = vaddps_avx512vl(in_ZMM17._0_32_,auVar63);
          auVar63 = vrsqrtps_avx(auVar65);
          auVar62._4_4_ = auVar65._4_4_ * auVar63._4_4_;
          auVar62._0_4_ = auVar65._0_4_ * auVar63._0_4_;
          auVar62._8_4_ = auVar65._8_4_ * auVar63._8_4_;
          auVar62._12_4_ = auVar65._12_4_ * auVar63._12_4_;
          auVar62._16_4_ = auVar65._16_4_ * auVar63._16_4_;
          auVar62._20_4_ = auVar65._20_4_ * auVar63._20_4_;
          auVar62._24_4_ = auVar65._24_4_ * auVar63._24_4_;
          auVar62._28_4_ = auVar65._28_4_;
          auVar55 = vfmadd213ps_fma(auVar62,auVar63,auVar66);
          auVar65._0_4_ = auVar63._0_4_ * -0.5 * auVar55._0_4_;
          auVar65._4_4_ = auVar63._4_4_ * -0.5 * auVar55._4_4_;
          auVar65._8_4_ = auVar63._8_4_ * -0.5 * auVar55._8_4_;
          auVar65._12_4_ = auVar63._12_4_ * -0.5 * auVar55._12_4_;
          auVar65._16_4_ = auVar63._16_4_ * -0.5 * 0.0;
          auVar65._20_4_ = auVar63._20_4_ * -0.5 * 0.0;
          auVar65._24_4_ = auVar63._24_4_ * -0.5 * 0.0;
          auVar65._28_4_ = 0;
          auVar62 = vxorps_avx512vl(in_ZMM16._0_32_,auVar67);
          auVar63._4_4_ = auVar65._4_4_ * auVar62._4_4_;
          auVar63._0_4_ = auVar65._0_4_ * auVar62._0_4_;
          auVar63._8_4_ = auVar65._8_4_ * auVar62._8_4_;
          auVar63._12_4_ = auVar65._12_4_ * auVar62._12_4_;
          auVar63._16_4_ = auVar65._16_4_ * auVar62._16_4_;
          auVar63._20_4_ = auVar65._20_4_ * auVar62._20_4_;
          auVar63._24_4_ = auVar65._24_4_ * auVar62._24_4_;
          auVar63._28_4_ = auVar62._28_4_;
          in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar65,0);
          auVar184 = vinsertf64x4_avx512f(in_ZMM16,auVar63,0);
          in_ZMM16 = auVar184;
        }
        else if (iVar36 == 0x10) {
          auVar184 = vbroadcastss_avx512f(auVar55);
          auVar184 = vaddps_avx512f(in_ZMM17,auVar184);
          auVar185 = vrsqrt14ps_avx512f(auVar184);
          auVar184 = vmulps_avx512f(auVar184,auVar185);
          auVar184 = vfmadd213ps_avx512f(auVar184,auVar185,auVar71);
          auVar185 = vmulps_avx512f(auVar185,auVar72);
          in_ZMM17 = vmulps_avx512f(auVar185,auVar184);
          auVar184 = vxorps_avx512dq(in_ZMM16,auVar73);
          auVar184 = vmulps_avx512f(in_ZMM17,auVar184);
          in_ZMM16 = auVar184;
        }
        auVar56 = in_ZMM17._0_16_;
        auVar63 = in_ZMM17._0_32_;
        auVar55 = in_ZMM16._0_16_;
        auVar62 = in_ZMM16._0_32_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var5[-3]) == 0) {
          auVar58 = auVar56;
          if (iVar36 != 4) {
            auVar58 = vbroadcastss_avx512vl(auVar56);
          }
          in_ZMM18 = ZEXT1664(auVar58);
          auVar57 = auVar55;
          if (iVar36 != 4) {
            auVar57 = vbroadcastss_avx512vl(auVar55);
          }
          in_ZMM19 = ZEXT1664(auVar57);
          if (iVar36 != 8) {
            auVar63 = vinsertf32x4_avx512vl(ZEXT1632(auVar58),auVar58,1);
          }
          in_ZMM20 = ZEXT3264(auVar63);
          if (iVar36 != 8) {
            auVar62 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
          }
          auVar185 = in_ZMM16;
          auVar74 = in_ZMM17;
          if (iVar36 != 0x10) {
            auVar74 = vinsertf64x4_avx512f(in_ZMM20,auVar63,1);
            auVar185 = vinsertf64x4_avx512f(ZEXT3264(auVar62),auVar62,1);
          }
          auVar184 = auVar185;
          uVar51 = 0;
          if (0xf < (int)uVar44) {
            iVar38 = 0x10;
            do {
              auVar184 = vfmadd132ps_avx512f(*pauVar49,auVar185,auVar74);
              *pauVar49 = auVar184;
              pauVar49 = pauVar49 + 1;
              iVar38 = iVar38 + 0x10;
              uVar51 = uVar47;
            } while (iVar38 <= (int)uVar44);
          }
          uVar39 = uVar51 | 8;
          while ((int)uVar39 <= (int)uVar44) {
            auVar184._0_32_ = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar62,auVar63);
            *(undefined1 (*) [32])*pauVar49 = auVar184._0_32_;
            pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
            uVar39 = uVar51 + 0x10;
            uVar51 = uVar51 + 8;
          }
          iVar38 = uVar51 + 4;
          while (iVar38 <= (int)uVar44) {
            auVar184._0_16_ = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar57,auVar58);
            *(undefined1 (*) [16])*pauVar49 = auVar184._0_16_;
            pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
            iVar38 = uVar51 + 8;
            uVar51 = uVar51 + 4;
          }
          if ((int)uVar51 < (int)uVar44) {
            auVar185 = vpbroadcastq_avx512f();
            in_ZMM17 = vbroadcastss_avx512f(auVar56);
            in_ZMM16 = vbroadcastss_avx512f(auVar55);
            uVar42 = 0;
            do {
              auVar184 = vpbroadcastq_avx512f();
              auVar74 = vporq_avx512f(auVar184,auVar69);
              auVar184 = vporq_avx512f(auVar184,auVar70);
              uVar20 = vpcmpuq_avx512f(auVar184,auVar185,2);
              bVar30 = (byte)uVar20;
              uVar20 = vpcmpuq_avx512f(auVar74,auVar185,2);
              bVar31 = (byte)uVar20;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar49 + uVar42 * 4);
              auVar91._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar91._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar91._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar91._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar91._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar91._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar91._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar91._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar91._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar91._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar91._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar91._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar91._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar91._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar91._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar91._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar75 = vfmadd213ps_avx512f(auVar91,in_ZMM17,in_ZMM16);
              auVar74 = *(undefined1 (*) [64])(*pauVar49 + uVar42 * 4);
              auVar184._0_4_ =
                   (uint)(bVar30 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar74._0_4_;
              bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
              auVar184._4_4_ = (uint)bVar7 * auVar75._4_4_ | (uint)!bVar7 * auVar74._4_4_;
              bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
              auVar184._8_4_ = (uint)bVar7 * auVar75._8_4_ | (uint)!bVar7 * auVar74._8_4_;
              bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
              auVar184._12_4_ = (uint)bVar7 * auVar75._12_4_ | (uint)!bVar7 * auVar74._12_4_;
              bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
              auVar184._16_4_ = (uint)bVar7 * auVar75._16_4_ | (uint)!bVar7 * auVar74._16_4_;
              bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
              auVar184._20_4_ = (uint)bVar7 * auVar75._20_4_ | (uint)!bVar7 * auVar74._20_4_;
              bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
              auVar184._24_4_ = (uint)bVar7 * auVar75._24_4_ | (uint)!bVar7 * auVar74._24_4_;
              bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
              auVar184._28_4_ = (uint)bVar7 * auVar75._28_4_ | (uint)!bVar7 * auVar74._28_4_;
              auVar184._32_4_ =
                   (uint)(bVar31 & 1) * auVar75._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar74._32_4_;
              bVar7 = (bool)(bVar31 >> 1 & 1);
              auVar184._36_4_ = (uint)bVar7 * auVar75._36_4_ | (uint)!bVar7 * auVar74._36_4_;
              bVar7 = (bool)(bVar31 >> 2 & 1);
              auVar184._40_4_ = (uint)bVar7 * auVar75._40_4_ | (uint)!bVar7 * auVar74._40_4_;
              bVar7 = (bool)(bVar31 >> 3 & 1);
              auVar184._44_4_ = (uint)bVar7 * auVar75._44_4_ | (uint)!bVar7 * auVar74._44_4_;
              bVar7 = (bool)(bVar31 >> 4 & 1);
              auVar184._48_4_ = (uint)bVar7 * auVar75._48_4_ | (uint)!bVar7 * auVar74._48_4_;
              bVar7 = (bool)(bVar31 >> 5 & 1);
              auVar184._52_4_ = (uint)bVar7 * auVar75._52_4_ | (uint)!bVar7 * auVar74._52_4_;
              bVar7 = (bool)(bVar31 >> 6 & 1);
              auVar184._56_4_ = (uint)bVar7 * auVar75._56_4_ | (uint)!bVar7 * auVar74._56_4_;
              auVar184._60_4_ =
                   (uint)(bVar31 >> 7) * auVar75._60_4_ |
                   (uint)!(bool)(bVar31 >> 7) * auVar74._60_4_;
              *(undefined1 (*) [64])(*pauVar49 + uVar42 * 4) = auVar184;
              uVar42 = uVar42 + 0x10;
            } while (((ulong)(~uVar51 + uVar44) + 0x10 & 0x1fffffff0) != uVar42);
          }
        }
        else {
          pauVar37 = pauVar50;
          pauVar41 = pauVar43;
          if (0xf < (int)uVar44 && iVar36 == 0x10) {
            iVar38 = 0x10;
            do {
              auVar184 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar41));
              auVar185 = vfmadd132ps_avx512f(*pauVar49,in_ZMM16,in_ZMM17);
              uVar3 = *(undefined4 *)*pauVar37;
              auVar29._4_4_ = uVar3;
              auVar29._0_4_ = uVar3;
              auVar29._8_4_ = uVar3;
              auVar29._12_4_ = uVar3;
              auVar29._16_4_ = uVar3;
              auVar29._20_4_ = uVar3;
              auVar29._24_4_ = uVar3;
              auVar29._28_4_ = uVar3;
              auVar29._32_4_ = uVar3;
              auVar29._36_4_ = uVar3;
              auVar29._40_4_ = uVar3;
              auVar29._44_4_ = uVar3;
              auVar29._48_4_ = uVar3;
              auVar29._52_4_ = uVar3;
              auVar29._56_4_ = uVar3;
              auVar29._60_4_ = uVar3;
              auVar184 = vfmadd213ps_avx512f(auVar185,auVar184,auVar29);
              *pauVar49 = auVar184;
              pauVar49 = pauVar49 + 1;
              pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              iVar38 = iVar38 + 0x10;
            } while (iVar38 <= (int)uVar44);
          }
          if (iVar36 == 8) {
            uVar51 = 8;
            if (0xf < (int)uVar44) {
              auVar185 = vinsertf64x4_avx512f(in_ZMM17,auVar63,1);
              in_ZMM18 = vinsertf64x4_avx512f(in_ZMM16,auVar62,1);
              iVar38 = 0x10;
              do {
                in_ZMM20 = ZEXT464(*(uint *)(*pauVar37 + 4));
                auVar184 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar41),auVar136,
                                             ZEXT464(*(uint *)(*pauVar41 + 4)));
                in_ZMM19 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar136,in_ZMM20);
                auVar74 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar185);
                auVar184 = vfmadd213ps_avx512f(auVar74,auVar184,in_ZMM19);
                *pauVar49 = auVar184;
                pauVar49 = pauVar49 + 1;
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                iVar38 = iVar38 + 0x10;
                uVar51 = uVar44 | 8;
              } while (iVar38 <= (int)uVar44);
            }
            for (; (int)uVar51 <= (int)uVar44; uVar51 = uVar51 + 8) {
              uVar3 = *(undefined4 *)*pauVar41;
              auVar169._4_4_ = uVar3;
              auVar169._0_4_ = uVar3;
              auVar169._8_4_ = uVar3;
              auVar169._12_4_ = uVar3;
              auVar169._16_4_ = uVar3;
              auVar169._20_4_ = uVar3;
              auVar169._24_4_ = uVar3;
              auVar169._28_4_ = uVar3;
              auVar65 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar62,auVar63);
              uVar3 = *(undefined4 *)*pauVar37;
              auVar64._4_4_ = uVar3;
              auVar64._0_4_ = uVar3;
              auVar64._8_4_ = uVar3;
              auVar64._12_4_ = uVar3;
              auVar64._16_4_ = uVar3;
              auVar64._20_4_ = uVar3;
              auVar64._24_4_ = uVar3;
              auVar64._28_4_ = uVar3;
              auVar184._0_32_ = vfmadd213ps_avx512vl(auVar65,auVar169,auVar64);
              *(undefined1 (*) [32])*pauVar49 = auVar184._0_32_;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
            }
          }
          if (iVar36 == 4) {
            uVar51 = 0;
            if (0xf < (int)uVar44) {
              auVar184 = vinsertf64x4_avx512f(in_ZMM17,auVar63,1);
              auVar185 = vpermpd_avx512f(auVar184,0x44);
              auVar184 = vinsertf64x4_avx512f(in_ZMM16,auVar62,1);
              in_ZMM18 = vpermpd_avx512f(auVar184,0x44);
              iVar38 = 0x10;
              do {
                auVar184 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 8)));
                auVar74 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar41 + 0xc)));
                auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar41),
                                           ZEXT416(*(uint *)(*pauVar41 + 4)),0);
                auVar65 = vpermpd_avx512vl(ZEXT1632(auVar58),0x50);
                auVar184 = vinsertf64x4_avx512f(auVar184,auVar65,0);
                auVar75 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                in_ZMM20 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                auVar89._0_48_ = auVar184._0_48_;
                auVar89._48_8_ = auVar74._48_8_;
                auVar89._56_8_ = auVar74._56_8_;
                auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                           ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                auVar65 = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                auVar184 = vinsertf64x4_avx512f(auVar75,auVar65,0);
                auVar90._0_48_ = auVar184._0_48_;
                auVar90._48_8_ = in_ZMM20._48_8_;
                auVar90._56_8_ = in_ZMM20._56_8_;
                auVar184 = vfmadd132ps_avx512f(*pauVar49,in_ZMM18,auVar185);
                auVar184 = vfmadd213ps_avx512f(auVar184,auVar89,auVar90);
                *pauVar49 = auVar184;
                pauVar49 = pauVar49 + 1;
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                iVar38 = iVar38 + 0x10;
                in_ZMM19 = auVar184;
                uVar51 = uVar47;
              } while (iVar38 <= (int)uVar44);
            }
            if ((int)(uVar51 | 8) <= (int)uVar44) {
              auVar92._32_32_ = auVar184._32_32_;
              auVar63 = vpermpd_avx512vl(auVar63,0x44);
              auVar92._0_32_ = vpermpd_avx512vl(auVar62,0x44);
              in_ZMM18 = ZEXT3264(auVar92._0_32_);
              auVar184 = auVar92;
              uVar39 = uVar51;
              do {
                auVar58 = vshufps_avx(ZEXT416(*(uint *)*pauVar41),ZEXT416(*(uint *)(*pauVar41 + 4)),
                                      0);
                auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                           ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                auVar62 = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                auVar65 = vpermpd_avx2(ZEXT1632(auVar57),0x50);
                auVar64 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])*pauVar49,auVar92._0_32_,auVar63);
                auVar184._0_32_ = vfmadd213ps_avx512vl(auVar64,auVar62,auVar65);
                in_ZMM19 = ZEXT3264(auVar184._0_32_);
                *(undefined1 (*) [32])*pauVar49 = auVar184._0_32_;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar41 = (undefined1 (*) [64])(*pauVar41 + 8);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                uVar51 = uVar39 + 8;
                iVar38 = uVar39 + 0x10;
                uVar39 = uVar51;
              } while (iVar38 <= (int)uVar44);
            }
            while (uVar51 = uVar51 + 4, (int)uVar51 <= (int)uVar44) {
              uVar3 = *(undefined4 *)*pauVar41;
              auVar158._4_4_ = uVar3;
              auVar158._0_4_ = uVar3;
              auVar158._8_4_ = uVar3;
              auVar158._12_4_ = uVar3;
              auVar58 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar55,auVar56);
              uVar3 = *(undefined4 *)*pauVar37;
              auVar23._4_4_ = uVar3;
              auVar23._0_4_ = uVar3;
              auVar23._8_4_ = uVar3;
              auVar23._12_4_ = uVar3;
              auVar184._0_16_ = vfmadd213ps_avx512vl(auVar58,auVar158,auVar23);
              *(undefined1 (*) [16])*pauVar49 = auVar184._0_16_;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar41 = (undefined1 (*) [64])(*pauVar41 + 4);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
            }
          }
          if (iVar36 == 1) {
            in_ZMM18 = vbroadcastss_avx512f(auVar56);
            in_ZMM19 = vbroadcastss_avx512f(auVar55);
            auVar184 = in_ZMM19;
            uVar51 = 0;
            if (0xf < (int)uVar44) {
              iVar38 = 0x10;
              do {
                auVar184 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,in_ZMM18);
                auVar184 = vfmadd213ps_avx512f(auVar184,*pauVar41,*pauVar37);
                *pauVar49 = auVar184;
                pauVar49 = pauVar49 + 1;
                pauVar41 = pauVar41 + 1;
                pauVar37 = pauVar37 + 1;
                iVar38 = iVar38 + 0x10;
                uVar51 = uVar47;
              } while (iVar38 <= (int)uVar44);
            }
            uVar39 = uVar51 | 8;
            while ((int)uVar39 <= (int)uVar44) {
              auVar184._0_32_ =
                   vfmadd132ps_avx512vl
                             (*(undefined1 (*) [32])*pauVar49,in_ZMM19._0_32_,in_ZMM18._0_32_);
              auVar58 = vfmadd213ps_fma(auVar184._0_32_,*(undefined1 (*) [32])*pauVar41,
                                        *(undefined1 (*) [32])*pauVar37);
              *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar58);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x20);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
              uVar39 = uVar51 + 0x10;
              uVar51 = uVar51 + 8;
            }
            iVar38 = uVar51 + 4;
            while (iVar38 <= (int)uVar44) {
              auVar184._0_16_ =
                   vfmadd132ps_avx512vl
                             (*(undefined1 (*) [16])*pauVar49,in_ZMM19._0_16_,in_ZMM18._0_16_);
              auVar58 = vfmadd213ps_fma(auVar184._0_16_,*(undefined1 (*) [16])*pauVar41,
                                        *(undefined1 (*) [16])*pauVar37);
              *(undefined1 (*) [16])*pauVar49 = auVar58;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
              iVar38 = uVar51 + 8;
              uVar51 = uVar51 + 4;
            }
            if (uVar44 - uVar51 != 0 && (int)uVar51 <= (int)uVar44) {
              lVar52 = 0;
              do {
                auVar184._0_16_ =
                     vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar52 * 4)),auVar55,auVar56)
                ;
                auVar58 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar41 + lVar52 * 4)),auVar184._0_16_
                                          ,ZEXT416(*(uint *)(*pauVar37 + lVar52 * 4)));
                *(int *)(*pauVar49 + lVar52 * 4) = auVar58._0_4_;
                lVar52 = lVar52 + 1;
              } while (uVar44 - uVar51 != (int)lVar52);
            }
          }
        }
        uVar48 = uVar48 + 1;
      } while (uVar48 != uVar45);
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}